

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  RTCFeatureFlags RVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  int iVar55;
  ulong uVar56;
  long lVar57;
  RTCFilterFunctionN p_Var58;
  RayHitK<4> *pRVar59;
  RTCIntersectArguments *pRVar60;
  int iVar61;
  undefined4 uVar62;
  RTCIntersectArguments *pRVar63;
  ulong uVar65;
  Geometry *pGVar66;
  long lVar67;
  long lVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  short sVar78;
  undefined2 uVar115;
  float fVar79;
  float fVar116;
  float fVar117;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar118;
  undefined8 uVar119;
  float fVar120;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar121;
  float fVar122;
  float fVar154;
  float fVar156;
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar169;
  float fVar170;
  vfloat4 v;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar188;
  float fVar191;
  vfloat4 v_1;
  undefined1 auVar174 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  float fVar189;
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar196;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar229;
  float fVar230;
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar232;
  float fVar236;
  float fVar238;
  undefined1 auVar233 [16];
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar250;
  float fVar253;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar249 [16];
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar259 [16];
  float fVar262;
  float fVar269;
  float fVar270;
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar299;
  float fVar308;
  float fVar309;
  float fVar311;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar310;
  undefined1 auVar307 [16];
  float fVar312;
  float fVar313;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar324;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar325;
  undefined1 auVar323 [16];
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_438;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  Precalculations *local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  RTCFilterFunctionNArguments local_378;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c8;
  Primitive *local_2c0;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  LinearSpace3fa *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  uint local_1f8;
  int local_1f4;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  float local_198 [4];
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178 [4];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [12];
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  RTCIntersectArguments *pRVar64;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 uVar114;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  
  PVar18 = prim[1];
  uVar56 = (ulong)(byte)PVar18;
  lVar23 = uVar56 * 0x25;
  pPVar7 = prim + lVar23 + 6;
  fVar170 = *(float *)(pPVar7 + 0xc);
  fVar171 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar170;
  fVar188 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar170;
  fVar191 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar170;
  fVar159 = *(float *)(ray + k * 4 + 0x40) * fVar170;
  fVar169 = *(float *)(ray + k * 4 + 0x50) * fVar170;
  fVar170 = *(float *)(ray + k * 4 + 0x60) * fVar170;
  uVar62 = *(undefined4 *)(prim + uVar56 * 4 + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar69;
  auVar267._12_2_ = uVar115;
  auVar267._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar80._12_4_ = auVar267._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar69;
  auVar80._10_2_ = uVar115;
  auVar161._10_6_ = auVar80._10_6_;
  auVar161._8_2_ = uVar115;
  auVar161._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar29._4_8_ = auVar161._8_8_;
  auVar29._2_2_ = uVar115;
  auVar29._0_2_ = uVar115;
  fVar312 = (float)((int)sVar78 >> 8);
  fVar318 = (float)(auVar29._0_4_ >> 0x18);
  fVar319 = (float)(auVar161._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar56 * 5 + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar69;
  auVar125._12_2_ = uVar115;
  auVar125._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar69;
  auVar124._10_2_ = uVar115;
  auVar123._10_6_ = auVar124._10_6_;
  auVar123._8_2_ = uVar115;
  auVar123._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar30._4_8_ = auVar123._8_8_;
  auVar30._2_2_ = uVar115;
  auVar30._0_2_ = uVar115;
  fVar196 = (float)((int)sVar78 >> 8);
  fVar204 = (float)(auVar30._0_4_ >> 0x18);
  fVar205 = (float)(auVar123._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar56 * 6 + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar69;
  auVar128._12_2_ = uVar115;
  auVar128._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar69;
  auVar127._10_2_ = uVar115;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = uVar115;
  auVar126._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar31._4_8_ = auVar126._8_8_;
  auVar31._2_2_ = uVar115;
  auVar31._0_2_ = uVar115;
  fVar231 = (float)((int)sVar78 >> 8);
  fVar236 = (float)(auVar31._0_4_ >> 0x18);
  fVar238 = (float)(auVar126._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar56 * 0xf + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar69;
  auVar131._12_2_ = uVar115;
  auVar131._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar69;
  auVar130._10_2_ = uVar115;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar115;
  auVar129._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar32._4_8_ = auVar129._8_8_;
  auVar32._2_2_ = uVar115;
  auVar32._0_2_ = uVar115;
  fVar79 = (float)((int)sVar78 >> 8);
  fVar116 = (float)(auVar32._0_4_ >> 0x18);
  fVar117 = (float)(auVar129._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar69;
  auVar209._12_2_ = uVar115;
  auVar209._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar69;
  auVar208._10_2_ = uVar115;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar115;
  auVar207._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar33._4_8_ = auVar207._8_8_;
  auVar33._2_2_ = uVar115;
  auVar33._0_2_ = uVar115;
  fVar241 = (float)((int)sVar78 >> 8);
  fVar250 = (float)(auVar33._0_4_ >> 0x18);
  fVar253 = (float)(auVar207._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar56 + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar69;
  auVar212._12_2_ = uVar115;
  auVar212._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar69;
  auVar211._10_2_ = uVar115;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar115;
  auVar210._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar34._4_8_ = auVar210._8_8_;
  auVar34._2_2_ = uVar115;
  auVar34._0_2_ = uVar115;
  fVar262 = (float)((int)sVar78 >> 8);
  fVar269 = (float)(auVar34._0_4_ >> 0x18);
  fVar270 = (float)(auVar210._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar56 * 0x1a + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar69;
  auVar215._12_2_ = uVar115;
  auVar215._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar69;
  auVar214._10_2_ = uVar115;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar115;
  auVar213._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar35._4_8_ = auVar213._8_8_;
  auVar35._2_2_ = uVar115;
  auVar35._0_2_ = uVar115;
  fVar258 = (float)((int)sVar78 >> 8);
  fVar260 = (float)(auVar35._0_4_ >> 0x18);
  fVar261 = (float)(auVar213._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar56 * 0x1b + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar69;
  auVar218._12_2_ = uVar115;
  auVar218._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar69;
  auVar217._10_2_ = uVar115;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar115;
  auVar216._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar36._4_8_ = auVar216._8_8_;
  auVar36._2_2_ = uVar115;
  auVar36._0_2_ = uVar115;
  fVar271 = (float)((int)sVar78 >> 8);
  fVar281 = (float)(auVar36._0_4_ >> 0x18);
  fVar284 = (float)(auVar216._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar56 * 0x1c + 6);
  uVar114 = (undefined1)((uint)uVar62 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar62 >> 0x10);
  uVar119 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar62));
  uVar114 = (undefined1)((uint)uVar62 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar119 >> 0x20),uVar114),uVar114);
  sVar78 = CONCAT11((char)uVar62,(char)uVar62);
  uVar69 = CONCAT62(uVar28,sVar78);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar69;
  auVar221._12_2_ = uVar115;
  auVar221._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar119 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar69;
  auVar220._10_2_ = uVar115;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar115;
  auVar219._0_8_ = uVar69;
  uVar115 = (undefined2)uVar28;
  auVar37._4_8_ = auVar219._8_8_;
  auVar37._2_2_ = uVar115;
  auVar37._0_2_ = uVar115;
  fVar121 = (float)((int)sVar78 >> 8);
  fVar154 = (float)(auVar37._0_4_ >> 0x18);
  fVar156 = (float)(auVar219._8_4_ >> 0x18);
  fVar299 = fVar159 * fVar312 + fVar169 * fVar196 + fVar170 * fVar231;
  fVar308 = fVar159 * fVar318 + fVar169 * fVar204 + fVar170 * fVar236;
  fVar309 = fVar159 * fVar319 + fVar169 * fVar205 + fVar170 * fVar238;
  fVar311 = fVar159 * (float)(auVar80._12_4_ >> 0x18) +
            fVar169 * (float)(auVar124._12_4_ >> 0x18) + fVar170 * (float)(auVar127._12_4_ >> 0x18);
  fVar289 = fVar159 * fVar79 + fVar169 * fVar241 + fVar170 * fVar262;
  fVar296 = fVar159 * fVar116 + fVar169 * fVar250 + fVar170 * fVar269;
  fVar297 = fVar159 * fVar117 + fVar169 * fVar253 + fVar170 * fVar270;
  fVar298 = fVar159 * (float)(auVar130._12_4_ >> 0x18) +
            fVar169 * (float)(auVar208._12_4_ >> 0x18) + fVar170 * (float)(auVar211._12_4_ >> 0x18);
  fVar206 = fVar159 * fVar258 + fVar169 * fVar271 + fVar170 * fVar121;
  fVar229 = fVar159 * fVar260 + fVar169 * fVar281 + fVar170 * fVar154;
  fVar230 = fVar159 * fVar261 + fVar169 * fVar284 + fVar170 * fVar156;
  fVar159 = fVar159 * (float)(auVar214._12_4_ >> 0x18) +
            fVar169 * (float)(auVar217._12_4_ >> 0x18) + fVar170 * (float)(auVar220._12_4_ >> 0x18);
  fVar313 = fVar312 * fVar171 + fVar196 * fVar188 + fVar231 * fVar191;
  fVar318 = fVar318 * fVar171 + fVar204 * fVar188 + fVar236 * fVar191;
  fVar319 = fVar319 * fVar171 + fVar205 * fVar188 + fVar238 * fVar191;
  fVar320 = (float)(auVar80._12_4_ >> 0x18) * fVar171 +
            (float)(auVar124._12_4_ >> 0x18) * fVar188 + (float)(auVar127._12_4_ >> 0x18) * fVar191;
  fVar262 = fVar79 * fVar171 + fVar241 * fVar188 + fVar262 * fVar191;
  fVar269 = fVar116 * fVar171 + fVar250 * fVar188 + fVar269 * fVar191;
  fVar270 = fVar117 * fVar171 + fVar253 * fVar188 + fVar270 * fVar191;
  fVar312 = (float)(auVar130._12_4_ >> 0x18) * fVar171 +
            (float)(auVar208._12_4_ >> 0x18) * fVar188 + (float)(auVar211._12_4_ >> 0x18) * fVar191;
  fVar258 = fVar171 * fVar258 + fVar188 * fVar271 + fVar191 * fVar121;
  fVar260 = fVar171 * fVar260 + fVar188 * fVar281 + fVar191 * fVar154;
  fVar261 = fVar171 * fVar261 + fVar188 * fVar284 + fVar191 * fVar156;
  fVar271 = fVar171 * (float)(auVar214._12_4_ >> 0x18) +
            fVar188 * (float)(auVar217._12_4_ >> 0x18) + fVar191 * (float)(auVar220._12_4_ >> 0x18);
  fVar170 = (float)DAT_01ff1d40;
  fVar79 = DAT_01ff1d40._4_4_;
  fVar116 = DAT_01ff1d40._8_4_;
  fVar117 = DAT_01ff1d40._12_4_;
  uVar70 = -(uint)(fVar170 <= ABS(fVar299));
  uVar71 = -(uint)(fVar79 <= ABS(fVar308));
  uVar73 = -(uint)(fVar116 <= ABS(fVar309));
  uVar75 = -(uint)(fVar117 <= ABS(fVar311));
  auVar300._0_4_ = (uint)fVar299 & uVar70;
  auVar300._4_4_ = (uint)fVar308 & uVar71;
  auVar300._8_4_ = (uint)fVar309 & uVar73;
  auVar300._12_4_ = (uint)fVar311 & uVar75;
  auVar174._0_4_ = ~uVar70 & (uint)fVar170;
  auVar174._4_4_ = ~uVar71 & (uint)fVar79;
  auVar174._8_4_ = ~uVar73 & (uint)fVar116;
  auVar174._12_4_ = ~uVar75 & (uint)fVar117;
  auVar174 = auVar174 | auVar300;
  uVar70 = -(uint)(fVar170 <= ABS(fVar289));
  uVar71 = -(uint)(fVar79 <= ABS(fVar296));
  uVar73 = -(uint)(fVar116 <= ABS(fVar297));
  uVar75 = -(uint)(fVar117 <= ABS(fVar298));
  auVar290._0_4_ = (uint)fVar289 & uVar70;
  auVar290._4_4_ = (uint)fVar296 & uVar71;
  auVar290._8_4_ = (uint)fVar297 & uVar73;
  auVar290._12_4_ = (uint)fVar298 & uVar75;
  auVar233._0_4_ = ~uVar70 & (uint)fVar170;
  auVar233._4_4_ = ~uVar71 & (uint)fVar79;
  auVar233._8_4_ = ~uVar73 & (uint)fVar116;
  auVar233._12_4_ = ~uVar75 & (uint)fVar117;
  auVar233 = auVar233 | auVar290;
  uVar70 = -(uint)(fVar170 <= ABS(fVar206));
  uVar71 = -(uint)(fVar79 <= ABS(fVar229));
  uVar73 = -(uint)(fVar116 <= ABS(fVar230));
  uVar75 = -(uint)(fVar117 <= ABS(fVar159));
  auVar222._0_4_ = (uint)fVar206 & uVar70;
  auVar222._4_4_ = (uint)fVar229 & uVar71;
  auVar222._8_4_ = (uint)fVar230 & uVar73;
  auVar222._12_4_ = (uint)fVar159 & uVar75;
  auVar244._0_4_ = ~uVar70 & (uint)fVar170;
  auVar244._4_4_ = ~uVar71 & (uint)fVar79;
  auVar244._8_4_ = ~uVar73 & (uint)fVar116;
  auVar244._12_4_ = ~uVar75 & (uint)fVar117;
  auVar244 = auVar244 | auVar222;
  auVar80 = rcpps(_DAT_01ff1d40,auVar174);
  fVar170 = auVar80._0_4_;
  fVar117 = auVar80._4_4_;
  fVar196 = auVar80._8_4_;
  fVar241 = auVar80._12_4_;
  fVar170 = (1.0 - auVar174._0_4_ * fVar170) * fVar170 + fVar170;
  fVar117 = (1.0 - auVar174._4_4_ * fVar117) * fVar117 + fVar117;
  fVar196 = (1.0 - auVar174._8_4_ * fVar196) * fVar196 + fVar196;
  fVar241 = (1.0 - auVar174._12_4_ * fVar241) * fVar241 + fVar241;
  auVar80 = rcpps(auVar80,auVar233);
  fVar79 = auVar80._0_4_;
  fVar121 = auVar80._4_4_;
  fVar204 = auVar80._8_4_;
  fVar250 = auVar80._12_4_;
  fVar79 = (1.0 - auVar233._0_4_ * fVar79) * fVar79 + fVar79;
  fVar121 = (1.0 - auVar233._4_4_ * fVar121) * fVar121 + fVar121;
  fVar204 = (1.0 - auVar233._8_4_ * fVar204) * fVar204 + fVar204;
  fVar250 = (1.0 - auVar233._12_4_ * fVar250) * fVar250 + fVar250;
  auVar80 = rcpps(auVar80,auVar244);
  fVar116 = auVar80._0_4_;
  fVar154 = auVar80._4_4_;
  fVar205 = auVar80._8_4_;
  fVar253 = auVar80._12_4_;
  fVar116 = (1.0 - auVar244._0_4_ * fVar116) * fVar116 + fVar116;
  fVar154 = (1.0 - auVar244._4_4_ * fVar154) * fVar154 + fVar154;
  fVar205 = (1.0 - auVar244._8_4_ * fVar205) * fVar205 + fVar205;
  fVar253 = (1.0 - auVar244._12_4_ * fVar253) * fVar253 + fVar253;
  fVar281 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar69 = *(ulong *)(prim + uVar56 * 7 + 6);
  uVar115 = (undefined2)(uVar69 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar69;
  auVar83._12_2_ = uVar115;
  auVar83._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar69 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar69;
  auVar82._10_2_ = uVar115;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar115;
  auVar81._0_8_ = uVar69;
  uVar115 = (undefined2)(uVar69 >> 0x10);
  auVar38._4_8_ = auVar81._8_8_;
  auVar38._2_2_ = uVar115;
  auVar38._0_2_ = uVar115;
  fVar156 = (float)(auVar38._0_4_ >> 0x10);
  fVar206 = (float)(auVar81._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar56 * 0xb + 6);
  uVar115 = (undefined2)(uVar9 >> 0x30);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar9;
  auVar177._12_2_ = uVar115;
  auVar177._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar9 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar9;
  auVar176._10_2_ = uVar115;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar115;
  auVar175._0_8_ = uVar9;
  uVar115 = (undefined2)(uVar9 >> 0x10);
  auVar39._4_8_ = auVar175._8_8_;
  auVar39._2_2_ = uVar115;
  auVar39._0_2_ = uVar115;
  uVar10 = *(ulong *)(prim + uVar56 * 9 + 6);
  uVar115 = (undefined2)(uVar10 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar10;
  auVar86._12_2_ = uVar115;
  auVar86._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar10 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar10;
  auVar85._10_2_ = uVar115;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar115;
  auVar84._0_8_ = uVar10;
  uVar115 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar84._8_8_;
  auVar40._2_2_ = uVar115;
  auVar40._0_2_ = uVar115;
  fVar159 = (float)(auVar40._0_4_ >> 0x10);
  fVar229 = (float)(auVar84._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar56 * 0xd + 6);
  uVar115 = (undefined2)(uVar11 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar11;
  auVar247._12_2_ = uVar115;
  auVar247._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar11 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar11;
  auVar246._10_2_ = uVar115;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar115;
  auVar245._0_8_ = uVar11;
  uVar115 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar245._8_8_;
  auVar41._2_2_ = uVar115;
  auVar41._0_2_ = uVar115;
  uVar12 = *(ulong *)(prim + uVar56 * 0x12 + 6);
  uVar115 = (undefined2)(uVar12 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar12;
  auVar89._12_2_ = uVar115;
  auVar89._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar12 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar12;
  auVar88._10_2_ = uVar115;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar115;
  auVar87._0_8_ = uVar12;
  uVar115 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar87._8_8_;
  auVar42._2_2_ = uVar115;
  auVar42._0_2_ = uVar115;
  fVar169 = (float)(auVar42._0_4_ >> 0x10);
  fVar230 = (float)(auVar87._8_4_ >> 0x10);
  uVar65 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar56 * 2 + uVar65 + 6);
  uVar115 = (undefined2)(uVar13 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar13;
  auVar265._12_2_ = uVar115;
  auVar265._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar13 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar13;
  auVar264._10_2_ = uVar115;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar115;
  auVar263._0_8_ = uVar13;
  uVar115 = (undefined2)(uVar13 >> 0x10);
  auVar43._4_8_ = auVar263._8_8_;
  auVar43._2_2_ = uVar115;
  auVar43._0_2_ = uVar115;
  uVar65 = *(ulong *)(prim + uVar65 + 6);
  uVar115 = (undefined2)(uVar65 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar65;
  auVar92._12_2_ = uVar115;
  auVar92._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar65 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar65;
  auVar91._10_2_ = uVar115;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar115;
  auVar90._0_8_ = uVar65;
  uVar115 = (undefined2)(uVar65 >> 0x10);
  auVar44._4_8_ = auVar90._8_8_;
  auVar44._2_2_ = uVar115;
  auVar44._0_2_ = uVar115;
  fVar171 = (float)(auVar44._0_4_ >> 0x10);
  fVar231 = (float)(auVar90._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar56 * 0x18 + 6);
  uVar115 = (undefined2)(uVar14 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar14;
  auVar276._12_2_ = uVar115;
  auVar276._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar14 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar14;
  auVar275._10_2_ = uVar115;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar115;
  auVar274._0_8_ = uVar14;
  uVar115 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar274._8_8_;
  auVar45._2_2_ = uVar115;
  auVar45._0_2_ = uVar115;
  uVar15 = *(ulong *)(prim + uVar56 * 0x1d + 6);
  uVar115 = (undefined2)(uVar15 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar15;
  auVar95._12_2_ = uVar115;
  auVar95._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar15 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar15;
  auVar94._10_2_ = uVar115;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar115;
  auVar93._0_8_ = uVar15;
  uVar115 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar93._8_8_;
  auVar46._2_2_ = uVar115;
  auVar46._0_2_ = uVar115;
  fVar188 = (float)(auVar46._0_4_ >> 0x10);
  fVar236 = (float)(auVar93._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar56 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar115 = (undefined2)(uVar16 >> 0x30);
  auVar293._8_4_ = 0;
  auVar293._0_8_ = uVar16;
  auVar293._12_2_ = uVar115;
  auVar293._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar16 >> 0x20);
  auVar292._12_4_ = auVar293._12_4_;
  auVar292._8_2_ = 0;
  auVar292._0_8_ = uVar16;
  auVar292._10_2_ = uVar115;
  auVar291._10_6_ = auVar292._10_6_;
  auVar291._8_2_ = uVar115;
  auVar291._0_8_ = uVar16;
  uVar115 = (undefined2)(uVar16 >> 0x10);
  auVar47._4_8_ = auVar291._8_8_;
  auVar47._2_2_ = uVar115;
  auVar47._0_2_ = uVar115;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar56) + 6);
  uVar115 = (undefined2)(uVar17 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar17;
  auVar98._12_2_ = uVar115;
  auVar98._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar17 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar17;
  auVar97._10_2_ = uVar115;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar115;
  auVar96._0_8_ = uVar17;
  uVar115 = (undefined2)(uVar17 >> 0x10);
  auVar48._4_8_ = auVar96._8_8_;
  auVar48._2_2_ = uVar115;
  auVar48._0_2_ = uVar115;
  fVar191 = (float)(auVar48._0_4_ >> 0x10);
  fVar238 = (float)(auVar96._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar56 * 0x23 + 6);
  uVar115 = (undefined2)(uVar56 >> 0x30);
  auVar303._8_4_ = 0;
  auVar303._0_8_ = uVar56;
  auVar303._12_2_ = uVar115;
  auVar303._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar56 >> 0x20);
  auVar302._12_4_ = auVar303._12_4_;
  auVar302._8_2_ = 0;
  auVar302._0_8_ = uVar56;
  auVar302._10_2_ = uVar115;
  auVar301._10_6_ = auVar302._10_6_;
  auVar301._8_2_ = uVar115;
  auVar301._0_8_ = uVar56;
  uVar115 = (undefined2)(uVar56 >> 0x10);
  auVar49._4_8_ = auVar301._8_8_;
  auVar49._2_2_ = uVar115;
  auVar49._0_2_ = uVar115;
  auVar178._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar156) * fVar281 + fVar156) - fVar318) *
                fVar117,((((float)(int)(short)uVar9 - (float)(int)(short)uVar69) * fVar281 +
                         (float)(int)(short)uVar69) - fVar313) * fVar170);
  auVar178._8_4_ =
       ((((float)(auVar175._8_4_ >> 0x10) - fVar206) * fVar281 + fVar206) - fVar319) * fVar196;
  auVar178._12_4_ =
       ((((float)(auVar176._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar320) * fVar241;
  auVar248._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar281 +
        (float)(int)(short)uVar10) - fVar313) * fVar170;
  auVar248._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar159) * fVar281 + fVar159) - fVar318) * fVar117;
  auVar248._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar229) * fVar281 + fVar229) - fVar319) * fVar196;
  auVar248._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar320) * fVar241;
  auVar266._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar169) * fVar281 + fVar169) - fVar269) *
                fVar121,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar281 +
                         (float)(int)(short)uVar12) - fVar262) * fVar79);
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar230) * fVar281 + fVar230) - fVar270) * fVar204;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar312) * fVar250;
  auVar277._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar65) * fVar281 +
        (float)(int)(short)uVar65) - fVar262) * fVar79;
  auVar277._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar171) * fVar281 + fVar171) - fVar269) * fVar121;
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar231) * fVar281 + fVar231) - fVar270) * fVar204;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar312) * fVar250;
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar294._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar188) * fVar281 + fVar188) - fVar260) *
                fVar154,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar281 +
                         (float)(int)(short)uVar15) - fVar258) * fVar116);
  auVar294._8_4_ =
       ((((float)(auVar291._8_4_ >> 0x10) - fVar236) * fVar281 + fVar236) - fVar261) * fVar205;
  auVar294._12_4_ =
       ((((float)(auVar292._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar271) * fVar253;
  auVar304._0_4_ =
       ((((float)(int)(short)uVar56 - (float)(int)(short)uVar17) * fVar281 +
        (float)(int)(short)uVar17) - fVar258) * fVar116;
  auVar304._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar191) * fVar281 + fVar191) - fVar260) * fVar154;
  auVar304._8_4_ =
       ((((float)(auVar301._8_4_ >> 0x10) - fVar238) * fVar281 + fVar238) - fVar261) * fVar205;
  auVar304._12_4_ =
       ((((float)(auVar302._12_4_ >> 0x10) - (float)(auVar97._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar97._12_4_ >> 0x10)) - fVar271) * fVar253;
  auVar160._8_4_ = auVar178._8_4_;
  auVar160._0_8_ = auVar178._0_8_;
  auVar160._12_4_ = auVar178._12_4_;
  auVar161 = minps(auVar160,auVar248);
  auVar132._8_4_ = auVar266._8_4_;
  auVar132._0_8_ = auVar266._0_8_;
  auVar132._12_4_ = auVar266._12_4_;
  auVar80 = minps(auVar132,auVar277);
  auVar161 = maxps(auVar161,auVar80);
  auVar133._8_4_ = auVar294._8_4_;
  auVar133._0_8_ = auVar294._0_8_;
  auVar133._12_4_ = auVar294._12_4_;
  auVar80 = minps(auVar133,auVar304);
  auVar99._4_4_ = uVar62;
  auVar99._0_4_ = uVar62;
  auVar99._8_4_ = uVar62;
  auVar99._12_4_ = uVar62;
  auVar80 = maxps(auVar80,auVar99);
  auVar80 = maxps(auVar161,auVar80);
  auVar161 = maxps(auVar178,auVar248);
  auVar267 = maxps(auVar266,auVar277);
  auVar161 = minps(auVar161,auVar267);
  local_48 = auVar80._0_4_ * 0.99999964;
  fStack_44 = auVar80._4_4_ * 0.99999964;
  fStack_40 = auVar80._8_4_ * 0.99999964;
  fStack_3c = auVar80._12_4_ * 0.99999964;
  auVar80 = maxps(auVar294,auVar304);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar62;
  auVar100._0_4_ = uVar62;
  auVar100._8_4_ = uVar62;
  auVar100._12_4_ = uVar62;
  auVar80 = minps(auVar80,auVar100);
  auVar80 = minps(auVar161,auVar80);
  uVar70 = (uint)(byte)PVar18;
  auVar134._0_4_ = -(uint)(uVar70 != 0 && local_48 <= auVar80._0_4_ * 1.0000004);
  auVar134._4_4_ = -(uint)(1 < uVar70 && fStack_44 <= auVar80._4_4_ * 1.0000004);
  auVar134._8_4_ = -(uint)(2 < uVar70 && fStack_40 <= auVar80._8_4_ * 1.0000004);
  auVar134._12_4_ = -(uint)(3 < uVar70 && fStack_3c <= auVar80._12_4_ * 1.0000004);
  uVar70 = movmskps(uVar70,auVar134);
  if (uVar70 != 0) {
    uVar70 = uVar70 & 0xff;
    local_230 = pre->ray_space + k;
    local_398 = mm_lookupmask_ps._0_8_;
    uStack_390 = mm_lookupmask_ps._8_8_;
    local_2c8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_3b0 = pre;
    local_2c0 = prim;
    do {
      lVar23 = 0;
      if (uVar70 != 0) {
        for (; (uVar70 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar71 = *(uint *)(prim + 2);
      pRVar63 = (RTCIntersectArguments *)(ulong)uVar71;
      uVar73 = *(uint *)(prim + lVar23 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[(long)pRVar63].ptr;
      uVar69 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                               (ulong)uVar73 *
                               pGVar20[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar170 = pGVar20->fnumTimeSegments;
      fVar79 = (pGVar20->time_range).lower;
      fVar116 = ((*(float *)(ray + k * 4 + 0x70) - fVar79) / ((pGVar20->time_range).upper - fVar79))
                * fVar170;
      fVar79 = floorf(fVar116);
      fVar170 = fVar170 + -1.0;
      if (fVar170 <= fVar79) {
        fVar79 = fVar170;
      }
      fVar170 = 0.0;
      if (0.0 <= fVar79) {
        fVar170 = fVar79;
      }
      _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar57 = (long)(int)fVar170 * 0x38;
      lVar67 = *(long *)(_Var21 + 0x10 + lVar57);
      lVar68 = *(long *)(_Var21 + 0x38 + lVar57);
      lVar22 = *(long *)(_Var21 + 0x48 + lVar57);
      pfVar1 = (float *)(lVar68 + lVar22 * uVar69);
      lVar23 = uVar69 + 1;
      pfVar2 = (float *)(lVar68 + lVar22 * lVar23);
      p_Var58 = pGVar20[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var21 + lVar57) + lVar67 * uVar69);
      pfVar4 = (float *)(*(long *)(_Var21 + lVar57) + lVar67 * lVar23);
      pfVar5 = (float *)(*(long *)(p_Var58 + lVar57 + 0x38) +
                        uVar69 * *(long *)(p_Var58 + lVar57 + 0x48));
      fVar116 = fVar116 - fVar170;
      fVar121 = 1.0 - fVar116;
      pGVar66 = (Geometry *)(*(long *)(p_Var58 + lVar57 + 0x48) * lVar23);
      pfVar6 = (float *)((long)&(pGVar66->super_RefCount)._vptr_RefCount +
                        *(long *)(p_Var58 + lVar57 + 0x38));
      fVar196 = *pfVar3 * fVar121 + *pfVar1 * fVar116;
      fVar205 = pfVar3[1] * fVar121 + pfVar1[1] * fVar116;
      fVar229 = pfVar3[2] * fVar121 + pfVar1[2] * fVar116;
      fVar231 = pfVar3[3] * fVar121 + pfVar1[3] * fVar116;
      pfVar1 = (float *)(*(long *)(p_Var58 + lVar57) + *(long *)(p_Var58 + lVar57 + 0x10) * uVar69);
      fVar260 = *pfVar4 * fVar121 + *pfVar2 * fVar116;
      fVar261 = pfVar4[1] * fVar121 + pfVar2[1] * fVar116;
      fVar271 = pfVar4[2] * fVar121 + pfVar2[2] * fVar116;
      fStack_27c = pfVar4[3] * fVar121 + pfVar2[3] * fVar116;
      pfVar2 = (float *)(*(long *)(p_Var58 + lVar57) + *(long *)(p_Var58 + lVar57 + 0x10) * lVar23);
      iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar170 = *(float *)(ray + k * 4);
      fVar79 = *(float *)(ray + k * 4 + 0x10);
      fVar117 = *(float *)(ray + k * 4 + 0x20);
      fVar253 = (*pfVar1 * fVar121 + *pfVar5 * fVar116) * 0.33333334 + fVar196;
      fVar262 = (pfVar1[1] * fVar121 + pfVar5[1] * fVar116) * 0.33333334 + fVar205;
      fVar269 = (pfVar1[2] * fVar121 + pfVar5[2] * fVar116) * 0.33333334 + fVar229;
      fStack_28c = (pfVar1[3] * fVar121 + pfVar5[3] * fVar116) * 0.33333334 + fVar231;
      fVar270 = fVar260 - (fVar121 * *pfVar2 + fVar116 * *pfVar6) * 0.33333334;
      fVar312 = fVar261 - (fVar121 * pfVar2[1] + fVar116 * pfVar6[1]) * 0.33333334;
      fVar258 = fVar271 - (fVar121 * pfVar2[2] + fVar116 * pfVar6[2]) * 0.33333334;
      fStack_29c = fStack_27c - (fVar121 * pfVar2[3] + fVar116 * pfVar6[3]) * 0.33333334;
      fVar204 = fVar196 - fVar170;
      fVar206 = fVar205 - fVar79;
      fVar230 = fVar229 - fVar117;
      fVar116 = (local_230->vx).field_0.m128[0];
      fVar121 = (local_230->vx).field_0.m128[1];
      fVar154 = (local_230->vx).field_0.m128[2];
      fVar156 = (local_230->vy).field_0.m128[0];
      fVar159 = (local_230->vy).field_0.m128[1];
      fVar169 = (local_230->vy).field_0.m128[2];
      fVar171 = (local_230->vz).field_0.m128[0];
      fVar188 = (local_230->vz).field_0.m128[1];
      fVar191 = (local_230->vz).field_0.m128[2];
      local_128 = fVar204 * fVar116 + fVar206 * fVar156 + fVar230 * fVar171;
      local_248 = fVar204 * fVar121 + fVar206 * fVar159 + fVar230 * fVar188;
      fVar241 = fVar204 * fVar154 + fVar206 * fVar169 + fVar230 * fVar191;
      fVar204 = fVar253 - fVar170;
      fVar206 = fVar262 - fVar79;
      fVar230 = fVar269 - fVar117;
      fVar236 = fVar204 * fVar116 + fVar206 * fVar156 + fVar230 * fVar171;
      fVar238 = fVar204 * fVar121 + fVar206 * fVar159 + fVar230 * fVar188;
      local_2f8 = fVar204 * fVar154 + fVar206 * fVar169 + fVar230 * fVar191;
      fVar204 = fVar270 - fVar170;
      fVar206 = fVar312 - fVar79;
      fVar230 = fVar258 - fVar117;
      fVar250 = fVar204 * fVar116 + fVar206 * fVar156 + fVar230 * fVar171;
      local_2d8 = fVar204 * fVar121 + fVar206 * fVar159 + fVar230 * fVar188;
      local_308 = fVar204 * fVar154 + fVar206 * fVar169 + fVar230 * fVar191;
      fVar170 = fVar260 - fVar170;
      fVar79 = fVar261 - fVar79;
      fVar117 = fVar271 - fVar117;
      fVar116 = fVar170 * fVar116 + fVar79 * fVar156 + fVar117 * fVar171;
      local_2e8 = fVar170 * fVar121 + fVar79 * fVar159 + fVar117 * fVar188;
      local_318 = fVar170 * fVar154 + fVar79 * fVar169 + fVar117 * fVar191;
      auVar278._0_8_ = CONCAT44(local_248,local_128) & 0x7fffffff7fffffff;
      auVar278._8_4_ = ABS(fVar241);
      auVar278._12_4_ = ABS(fVar231);
      auVar197._0_8_ = CONCAT44(fVar238,fVar236) & 0x7fffffff7fffffff;
      auVar197._8_4_ = ABS(local_2f8);
      auVar197._12_4_ = ABS(fStack_28c);
      auVar161 = maxps(auVar278,auVar197);
      auVar223._0_8_ = CONCAT44(local_2d8,fVar250) & 0x7fffffff7fffffff;
      auVar223._8_4_ = ABS(local_308);
      auVar223._12_4_ = ABS(fStack_29c);
      auVar135._0_8_ = CONCAT44(local_2e8,fVar116) & 0x7fffffff7fffffff;
      auVar135._8_4_ = ABS(local_318);
      auVar135._12_4_ = ABS(fStack_27c);
      auVar80 = maxps(auVar223,auVar135);
      auVar80 = maxps(auVar161,auVar80);
      uVar119 = auVar80._8_8_;
      fVar170 = auVar80._4_4_;
      if (auVar80._4_4_ <= auVar80._0_4_) {
        fVar170 = auVar80._0_4_;
      }
      auVar279._8_8_ = uVar119;
      auVar279._0_8_ = uVar119;
      fVar79 = (float)iVar19;
      _local_2b8 = ZEXT416((uint)fVar79);
      if (auVar80._8_4_ <= fVar170) {
        auVar280._4_12_ = auVar279._4_12_;
        auVar280._0_4_ = fVar170;
        uVar119 = auVar280._0_8_;
      }
      iVar61 = iVar19 * 0x40;
      lVar23 = (long)iVar19 * 0x44;
      fVar117 = *(float *)(bezier_basis0 + lVar23 + 0x908);
      fVar121 = *(float *)(bezier_basis0 + lVar23 + 0x90c);
      fVar154 = *(float *)(bezier_basis0 + lVar23 + 0x910);
      fVar156 = *(float *)(bezier_basis0 + lVar23 + 0x914);
      fVar159 = *(float *)(bezier_basis0 + lVar23 + 0xd8c);
      fVar169 = *(float *)(bezier_basis0 + lVar23 + 0xd90);
      fVar171 = *(float *)(bezier_basis0 + lVar23 + 0xd94);
      fVar188 = *(float *)(bezier_basis0 + lVar23 + 0xd98);
      fVar191 = *(float *)(bezier_basis0 + lVar23 + 0x484);
      fVar204 = *(float *)(bezier_basis0 + lVar23 + 0x488);
      fVar206 = *(float *)(bezier_basis0 + lVar23 + 0x48c);
      fVar230 = *(float *)(bezier_basis0 + lVar23 + 0x490);
      local_258 = *(float *)(bezier_basis0 + lVar23);
      fStack_254 = *(float *)(bezier_basis0 + lVar23 + 4);
      fStack_250 = *(float *)(bezier_basis0 + lVar23 + 8);
      fStack_24c = *(float *)(bezier_basis0 + lVar23 + 0xc);
      local_338 = local_128 * local_258 + fVar236 * fVar191 + fVar250 * fVar117 + fVar116 * fVar159;
      fStack_334 = local_128 * fStack_254 +
                   fVar236 * fVar204 + fVar250 * fVar121 + fVar116 * fVar169;
      fStack_330 = local_128 * fStack_250 +
                   fVar236 * fVar206 + fVar250 * fVar154 + fVar116 * fVar171;
      fStack_32c = local_128 * fStack_24c +
                   fVar236 * fVar230 + fVar250 * fVar156 + fVar116 * fVar188;
      fVar326 = local_248 * local_258 +
                fVar238 * fVar191 + local_2d8 * fVar117 + local_2e8 * fVar159;
      fVar329 = local_248 * fStack_254 +
                fVar238 * fVar204 + local_2d8 * fVar121 + local_2e8 * fVar169;
      fVar333 = local_248 * fStack_250 +
                fVar238 * fVar206 + local_2d8 * fVar154 + local_2e8 * fVar171;
      fVar337 = local_248 * fStack_24c +
                fVar238 * fVar230 + local_2d8 * fVar156 + local_2e8 * fVar188;
      auVar305._0_4_ =
           fVar231 * local_258 + fStack_28c * fVar191 + fStack_29c * fVar117 + fStack_27c * fVar159;
      auVar305._4_4_ =
           fVar231 * fStack_254 + fStack_28c * fVar204 + fStack_29c * fVar121 + fStack_27c * fVar169
      ;
      auVar305._8_4_ =
           fVar231 * fStack_250 + fStack_28c * fVar206 + fStack_29c * fVar154 + fStack_27c * fVar171
      ;
      auVar305._12_4_ =
           fVar231 * fStack_24c + fStack_28c * fVar230 + fStack_29c * fVar156 + fStack_27c * fVar188
      ;
      fVar281 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar284 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fVar289 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fVar296 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      pauVar8 = (undefined1 (*) [16])(bezier_basis1 + lVar23 + 0x908);
      fVar170 = *(float *)*pauVar8;
      fVar297 = *(float *)(bezier_basis1 + lVar23 + 0x90c);
      fVar298 = *(float *)(bezier_basis1 + lVar23 + 0x910);
      auVar29 = *(undefined1 (*) [12])*pauVar8;
      fVar299 = *(float *)(bezier_basis1 + lVar23 + 0x914);
      _local_268 = *pauVar8;
      local_148 = fStack_27c;
      fStack_144 = fStack_27c;
      fStack_140 = fStack_27c;
      fStack_13c = fStack_27c;
      local_138 = fStack_29c;
      fStack_134 = fStack_29c;
      fStack_130 = fStack_29c;
      fStack_12c = fStack_29c;
      fVar308 = *(float *)(bezier_basis1 + lVar23 + 0x484);
      fVar309 = *(float *)(bezier_basis1 + lVar23 + 0x488);
      fVar311 = *(float *)(bezier_basis1 + lVar23 + 0x48c);
      fVar313 = *(float *)(bezier_basis1 + lVar23 + 0x490);
      local_158 = fStack_28c;
      fStack_154 = fStack_28c;
      fStack_150 = fStack_28c;
      fStack_14c = fStack_28c;
      fVar318 = *(float *)(bezier_basis1 + lVar23);
      fVar319 = *(float *)(bezier_basis1 + lVar23 + 4);
      fVar320 = *(float *)(bezier_basis1 + lVar23 + 8);
      fVar310 = *(float *)(bezier_basis1 + lVar23 + 0xc);
      fStack_124 = local_128;
      fStack_120 = local_128;
      fStack_11c = local_128;
      fVar242 = local_128 * fVar318 + fVar236 * fVar308 + fVar250 * fVar170 + fVar116 * fVar281;
      fVar251 = local_128 * fVar319 + fVar236 * fVar309 + fVar250 * fVar297 + fVar116 * fVar284;
      fVar254 = local_128 * fVar320 + fVar236 * fVar311 + fVar250 * fVar298 + fVar116 * fVar289;
      fVar256 = local_128 * fVar310 + fVar236 * fVar313 + fVar250 * fVar299 + fVar116 * fVar296;
      fVar232 = local_248 * fVar318 + fVar238 * fVar308 + local_2d8 * fVar170 + local_2e8 * fVar281;
      fVar237 = local_248 * fVar319 + fVar238 * fVar309 + local_2d8 * fVar297 + local_2e8 * fVar284;
      fVar239 = local_248 * fVar320 + fVar238 * fVar311 + local_2d8 * fVar298 + local_2e8 * fVar289;
      fVar240 = local_248 * fVar310 + fVar238 * fVar313 + local_2d8 * fVar299 + local_2e8 * fVar296;
      local_168 = fVar231;
      fStack_164 = fVar231;
      fStack_160 = fVar231;
      fStack_15c = fVar231;
      auVar224._0_4_ =
           fVar231 * fVar318 + fStack_28c * fVar308 + fStack_29c * fVar170 + fStack_27c * fVar281;
      auVar224._4_4_ =
           fVar231 * fVar319 + fStack_28c * fVar309 + fStack_29c * fVar297 + fStack_27c * fVar284;
      auVar224._8_4_ =
           fVar231 * fVar320 + fStack_28c * fVar311 + fStack_29c * fVar298 + fStack_27c * fVar289;
      auVar224._12_4_ =
           fVar231 * fVar310 + fStack_28c * fVar313 + fStack_29c * fVar299 + fStack_27c * fVar296;
      local_348 = fVar242 - local_338;
      fStack_344 = fVar251 - fStack_334;
      fStack_340 = fVar254 - fStack_330;
      fStack_33c = fVar256 - fStack_32c;
      fVar297 = fVar232 - fVar326;
      fVar298 = fVar237 - fVar329;
      fVar118 = fVar239 - fVar333;
      fVar120 = fVar240 - fVar337;
      local_328 = CONCAT44(fVar329,fVar326);
      uStack_320 = CONCAT44(fVar337,fVar333);
      fVar170 = fVar326 * local_348 - local_338 * fVar297;
      fVar330 = fVar329 * fStack_344 - fStack_334 * fVar298;
      fVar334 = fVar333 * fStack_340 - fStack_330 * fVar118;
      fVar338 = fVar337 * fStack_33c - fStack_32c * fVar120;
      auVar80 = maxps(auVar305,auVar224);
      bVar52 = fVar170 * fVar170 <=
               auVar80._0_4_ * auVar80._0_4_ * (local_348 * local_348 + fVar297 * fVar297) &&
               0.0 < fVar79;
      bVar53 = fVar330 * fVar330 <=
               auVar80._4_4_ * auVar80._4_4_ * (fStack_344 * fStack_344 + fVar298 * fVar298) &&
               1.0 < fVar79;
      bVar51 = fVar334 * fVar334 <=
               auVar80._8_4_ * auVar80._8_4_ * (fStack_340 * fStack_340 + fVar118 * fVar118) &&
               2.0 < fVar79;
      bVar50 = 3.0 < fVar79 &&
               fVar338 * fVar338 <=
               auVar80._12_4_ * auVar80._12_4_ * (fStack_33c * fStack_33c + fVar120 * fVar120);
      local_438 = (float)uVar119;
      local_438 = local_438 * 4.7683716e-07;
      auVar24._4_4_ = -(uint)bVar53;
      auVar24._0_4_ = -(uint)bVar52;
      auVar24._8_4_ = -(uint)bVar51;
      auVar24._12_4_ = -(uint)bVar50;
      iVar55 = movmskps(iVar19,auVar24);
      fVar170 = *(float *)(ray + k * 4 + 0x30);
      _local_388 = ZEXT416((uint)fVar170);
      fStack_314 = local_318;
      fStack_310 = local_318;
      fStack_30c = local_318;
      fStack_304 = local_308;
      fStack_300 = local_308;
      fStack_2fc = local_308;
      fStack_2f4 = local_2f8;
      fStack_2f0 = local_2f8;
      fStack_2ec = local_2f8;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      local_2a8 = fVar270;
      fStack_2a4 = fVar312;
      fStack_2a0 = fVar258;
      local_298 = fVar253;
      fStack_294 = fVar262;
      fStack_290 = fVar269;
      local_288 = fVar260;
      fStack_284 = fVar261;
      fStack_280 = fVar271;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      if (iVar55 != 0) {
        local_268._0_4_ = auVar29._0_4_;
        local_268._4_4_ = auVar29._4_4_;
        fStack_260 = auVar29._8_4_;
        fVar172 = fVar281 * local_318 + (float)local_268._0_4_ * local_308 + fVar308 * local_2f8 +
                  fVar318 * fVar241;
        fVar189 = fVar284 * local_318 + (float)local_268._4_4_ * local_308 + fVar309 * local_2f8 +
                  fVar319 * fVar241;
        fVar192 = fVar289 * local_318 + fStack_260 * local_308 + fVar311 * local_2f8 +
                  fVar320 * fVar241;
        fVar194 = fVar296 * local_318 + fVar299 * local_308 + fVar313 * local_2f8 +
                  fVar310 * fVar241;
        fVar173 = fVar159 * local_318 + fVar117 * local_308 + fVar191 * local_2f8 +
                  local_258 * fVar241;
        fVar190 = fVar169 * local_318 + fVar121 * local_308 + fVar204 * local_2f8 +
                  fStack_254 * fVar241;
        fVar193 = fVar171 * local_318 + fVar154 * local_308 + fVar206 * local_2f8 +
                  fStack_250 * fVar241;
        fVar195 = fVar188 * local_318 + fVar156 * local_308 + fVar230 * local_2f8 +
                  fStack_24c * fVar241;
        fVar117 = *(float *)(bezier_basis0 + lVar23 + 0x1210);
        fVar121 = *(float *)(bezier_basis0 + lVar23 + 0x1214);
        fVar154 = *(float *)(bezier_basis0 + lVar23 + 0x1218);
        fVar156 = *(float *)(bezier_basis0 + lVar23 + 0x121c);
        fVar159 = *(float *)(bezier_basis0 + lVar23 + 0x1694);
        fVar169 = *(float *)(bezier_basis0 + lVar23 + 0x1698);
        fVar171 = *(float *)(bezier_basis0 + lVar23 + 0x169c);
        fVar188 = *(float *)(bezier_basis0 + lVar23 + 0x16a0);
        fVar191 = *(float *)(bezier_basis0 + lVar23 + 0x1b18);
        fVar204 = *(float *)(bezier_basis0 + lVar23 + 0x1b1c);
        fVar206 = *(float *)(bezier_basis0 + lVar23 + 0x1b20);
        fVar230 = *(float *)(bezier_basis0 + lVar23 + 0x1b24);
        fVar281 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar284 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar289 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar296 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar272 = local_128 * fVar117 + fVar236 * fVar159 + fVar250 * fVar191 + fVar116 * fVar281;
        fVar282 = local_128 * fVar121 + fVar236 * fVar169 + fVar250 * fVar204 + fVar116 * fVar284;
        fVar285 = local_128 * fVar154 + fVar236 * fVar171 + fVar250 * fVar206 + fVar116 * fVar289;
        fVar287 = local_128 * fVar156 + fVar236 * fVar188 + fVar250 * fVar230 + fVar116 * fVar296;
        fVar327 = local_248 * fVar117 +
                  fVar238 * fVar159 + local_2d8 * fVar191 + local_2e8 * fVar281;
        fVar331 = local_248 * fVar121 +
                  fVar238 * fVar169 + local_2d8 * fVar204 + local_2e8 * fVar284;
        fVar335 = local_248 * fVar154 +
                  fVar238 * fVar171 + local_2d8 * fVar206 + local_2e8 * fVar289;
        fVar339 = local_248 * fVar156 +
                  fVar238 * fVar188 + local_2d8 * fVar230 + local_2e8 * fVar296;
        fVar299 = *(float *)(bezier_basis1 + lVar23 + 0x1210);
        fVar308 = *(float *)(bezier_basis1 + lVar23 + 0x1214);
        fVar309 = *(float *)(bezier_basis1 + lVar23 + 0x1218);
        fVar311 = *(float *)(bezier_basis1 + lVar23 + 0x121c);
        fVar313 = *(float *)(bezier_basis1 + lVar23 + 0x1b18);
        fVar318 = *(float *)(bezier_basis1 + lVar23 + 0x1b1c);
        fVar319 = *(float *)(bezier_basis1 + lVar23 + 0x1b20);
        fVar320 = *(float *)(bezier_basis1 + lVar23 + 0x1b24);
        fVar310 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar330 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar334 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar338 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar273 = *(float *)(bezier_basis1 + lVar23 + 0x1694);
        fVar283 = *(float *)(bezier_basis1 + lVar23 + 0x1698);
        fVar286 = *(float *)(bezier_basis1 + lVar23 + 0x169c);
        fVar288 = *(float *)(bezier_basis1 + lVar23 + 0x16a0);
        fVar243 = local_128 * fVar299 + fVar236 * fVar273 + fVar250 * fVar313 + fVar116 * fVar310;
        fVar252 = local_128 * fVar308 + fVar236 * fVar283 + fVar250 * fVar318 + fVar116 * fVar330;
        fVar255 = local_128 * fVar309 + fVar236 * fVar286 + fVar250 * fVar319 + fVar116 * fVar334;
        fVar257 = local_128 * fVar311 + fVar236 * fVar288 + fVar250 * fVar320 + fVar116 * fVar338;
        fVar122 = local_248 * fVar299 +
                  fVar238 * fVar273 + local_2d8 * fVar313 + local_2e8 * fVar310;
        fVar155 = local_248 * fVar308 +
                  fVar238 * fVar283 + local_2d8 * fVar318 + local_2e8 * fVar330;
        fVar157 = local_248 * fVar309 +
                  fVar238 * fVar286 + local_2d8 * fVar319 + local_2e8 * fVar334;
        fVar158 = local_248 * fVar311 +
                  fVar238 * fVar288 + local_2d8 * fVar320 + local_2e8 * fVar338;
        auVar306._0_8_ = CONCAT44(fVar282,fVar272) & 0x7fffffff7fffffff;
        auVar306._8_4_ = ABS(fVar285);
        auVar306._12_4_ = ABS(fVar287);
        auVar259._0_8_ = CONCAT44(fVar331,fVar327) & 0x7fffffff7fffffff;
        auVar259._8_4_ = ABS(fVar335);
        auVar259._12_4_ = ABS(fVar339);
        auVar80 = maxps(auVar306,auVar259);
        auVar314._0_8_ =
             CONCAT44(fVar121 * fVar241 +
                      fVar169 * local_2f8 + fVar204 * local_308 + fVar284 * local_318,
                      fVar117 * fVar241 +
                      fVar159 * local_2f8 + fVar191 * local_308 + fVar281 * local_318) &
             0x7fffffff7fffffff;
        auVar314._8_4_ =
             ABS(fVar154 * fVar241 + fVar171 * local_2f8 + fVar206 * local_308 + fVar289 * local_318
                );
        auVar314._12_4_ =
             ABS(fVar156 * fVar241 + fVar188 * local_2f8 + fVar230 * local_308 + fVar296 * local_318
                );
        auVar80 = maxps(auVar80,auVar314);
        uVar75 = -(uint)(local_438 <= auVar80._0_4_);
        uVar72 = -(uint)(local_438 <= auVar80._4_4_);
        uVar74 = -(uint)(local_438 <= auVar80._8_4_);
        uVar76 = -(uint)(local_438 <= auVar80._12_4_);
        auVar27._4_4_ = fStack_344;
        auVar27._0_4_ = local_348;
        auVar27._8_4_ = fStack_340;
        auVar27._12_4_ = fStack_33c;
        fVar169 = (float)((uint)fVar272 & uVar75 | ~uVar75 & (uint)local_348);
        fVar188 = (float)((uint)fVar282 & uVar72 | ~uVar72 & (uint)fStack_344);
        fVar230 = (float)((uint)fVar285 & uVar74 | ~uVar74 & (uint)fStack_340);
        fVar284 = (float)((uint)fVar287 & uVar76 | ~uVar76 & (uint)fStack_33c);
        fVar289 = (float)(~uVar75 & (uint)fVar297 | (uint)fVar327 & uVar75);
        fVar296 = (float)(~uVar72 & (uint)fVar298 | (uint)fVar331 & uVar72);
        fVar272 = (float)(~uVar74 & (uint)fVar118 | (uint)fVar335 & uVar74);
        fVar282 = (float)(~uVar76 & (uint)fVar120 | (uint)fVar339 & uVar76);
        auVar315._0_8_ = CONCAT44(fVar252,fVar243) & 0x7fffffff7fffffff;
        auVar315._8_4_ = ABS(fVar255);
        auVar315._12_4_ = ABS(fVar257);
        auVar268._0_8_ = CONCAT44(fVar155,fVar122) & 0x7fffffff7fffffff;
        auVar268._8_4_ = ABS(fVar157);
        auVar268._12_4_ = ABS(fVar158);
        auVar80 = maxps(auVar315,auVar268);
        auVar234._0_8_ =
             CONCAT44(fVar308 * fVar241 +
                      fVar283 * local_2f8 + fVar318 * local_308 + fVar330 * local_318,
                      fVar299 * fVar241 +
                      fVar273 * local_2f8 + fVar313 * local_308 + fVar310 * local_318) &
             0x7fffffff7fffffff;
        auVar234._8_4_ =
             ABS(fVar309 * fVar241 + fVar286 * local_2f8 + fVar319 * local_308 + fVar334 * local_318
                );
        auVar234._12_4_ =
             ABS(fVar311 * fVar241 + fVar288 * local_2f8 + fVar320 * local_308 + fVar338 * local_318
                );
        auVar80 = maxps(auVar80,auVar234);
        uVar75 = -(uint)(local_438 <= auVar80._0_4_);
        uVar72 = -(uint)(local_438 <= auVar80._4_4_);
        uVar74 = -(uint)(local_438 <= auVar80._8_4_);
        uVar76 = -(uint)(local_438 <= auVar80._12_4_);
        fVar159 = (float)((uint)fVar243 & uVar75 | ~uVar75 & (uint)local_348);
        fVar171 = (float)((uint)fVar252 & uVar72 | ~uVar72 & (uint)fStack_344);
        fVar191 = (float)((uint)fVar255 & uVar74 | ~uVar74 & (uint)fStack_340);
        fVar204 = (float)((uint)fVar257 & uVar76 | ~uVar76 & (uint)fStack_33c);
        fVar297 = (float)(~uVar75 & (uint)fVar297 | (uint)fVar122 & uVar75);
        fVar298 = (float)(~uVar72 & (uint)fVar298 | (uint)fVar155 & uVar72);
        fVar299 = (float)(~uVar74 & (uint)fVar118 | (uint)fVar157 & uVar74);
        fVar308 = (float)(~uVar76 & (uint)fVar120 | (uint)fVar158 & uVar76);
        auVar136._0_4_ = fVar289 * fVar289 + fVar169 * fVar169;
        auVar136._4_4_ = fVar296 * fVar296 + fVar188 * fVar188;
        auVar136._8_4_ = fVar272 * fVar272 + fVar230 * fVar230;
        auVar136._12_4_ = fVar282 * fVar282 + fVar284 * fVar284;
        auVar80 = rsqrtps(auVar27,auVar136);
        fVar117 = auVar80._0_4_;
        fVar121 = auVar80._4_4_;
        fVar154 = auVar80._8_4_;
        fVar156 = auVar80._12_4_;
        auVar198._0_4_ = fVar117 * fVar117 * auVar136._0_4_ * 0.5 * fVar117;
        auVar198._4_4_ = fVar121 * fVar121 * auVar136._4_4_ * 0.5 * fVar121;
        auVar198._8_4_ = fVar154 * fVar154 * auVar136._8_4_ * 0.5 * fVar154;
        auVar198._12_4_ = fVar156 * fVar156 * auVar136._12_4_ * 0.5 * fVar156;
        fVar309 = fVar117 * 1.5 - auVar198._0_4_;
        fVar311 = fVar121 * 1.5 - auVar198._4_4_;
        fVar313 = fVar154 * 1.5 - auVar198._8_4_;
        fVar318 = fVar156 * 1.5 - auVar198._12_4_;
        auVar137._0_4_ = fVar297 * fVar297 + fVar159 * fVar159;
        auVar137._4_4_ = fVar298 * fVar298 + fVar171 * fVar171;
        auVar137._8_4_ = fVar299 * fVar299 + fVar191 * fVar191;
        auVar137._12_4_ = fVar308 * fVar308 + fVar204 * fVar204;
        auVar80 = rsqrtps(auVar198,auVar137);
        fVar117 = auVar80._0_4_;
        fVar121 = auVar80._4_4_;
        fVar154 = auVar80._8_4_;
        fVar156 = auVar80._12_4_;
        fVar117 = fVar117 * 1.5 - fVar117 * fVar117 * auVar137._0_4_ * 0.5 * fVar117;
        fVar206 = fVar121 * 1.5 - fVar121 * fVar121 * auVar137._4_4_ * 0.5 * fVar121;
        fVar154 = fVar154 * 1.5 - fVar154 * fVar154 * auVar137._8_4_ * 0.5 * fVar154;
        fVar281 = fVar156 * 1.5 - fVar156 * fVar156 * auVar137._12_4_ * 0.5 * fVar156;
        fVar319 = fVar289 * fVar309 * auVar305._0_4_;
        fVar320 = fVar296 * fVar311 * auVar305._4_4_;
        fVar310 = fVar272 * fVar313 * auVar305._8_4_;
        fVar118 = fVar282 * fVar318 * auVar305._12_4_;
        fVar121 = -fVar169 * fVar309 * auVar305._0_4_;
        fVar156 = -fVar188 * fVar311 * auVar305._4_4_;
        fVar169 = -fVar230 * fVar313 * auVar305._8_4_;
        fVar188 = -fVar284 * fVar318 * auVar305._12_4_;
        fVar272 = fVar309 * 0.0 * auVar305._0_4_;
        fVar282 = fVar311 * 0.0 * auVar305._4_4_;
        fVar285 = fVar313 * 0.0 * auVar305._8_4_;
        fVar287 = fVar318 * 0.0 * auVar305._12_4_;
        fVar243 = fVar297 * fVar117 * auVar224._0_4_;
        fVar252 = fVar298 * fVar206 * auVar224._4_4_;
        fVar255 = fVar299 * fVar154 * auVar224._8_4_;
        fVar257 = fVar308 * fVar281 * auVar224._12_4_;
        fVar120 = fVar242 + fVar243;
        fVar330 = fVar251 + fVar252;
        fVar334 = fVar254 + fVar255;
        fVar338 = fVar256 + fVar257;
        fVar298 = -fVar159 * fVar117 * auVar224._0_4_;
        fVar308 = -fVar171 * fVar206 * auVar224._4_4_;
        fVar311 = -fVar191 * fVar154 * auVar224._8_4_;
        fVar318 = -fVar204 * fVar281 * auVar224._12_4_;
        fVar273 = fVar232 + fVar298;
        fVar283 = fVar237 + fVar308;
        fVar286 = fVar239 + fVar311;
        fVar288 = fVar240 + fVar318;
        fVar204 = fVar117 * 0.0 * auVar224._0_4_;
        fVar230 = fVar206 * 0.0 * auVar224._4_4_;
        fVar284 = fVar154 * 0.0 * auVar224._8_4_;
        fVar296 = fVar281 * 0.0 * auVar224._12_4_;
        fVar117 = local_338 - fVar319;
        fVar154 = fStack_334 - fVar320;
        fVar159 = fStack_330 - fVar310;
        fVar171 = fStack_32c - fVar118;
        fVar122 = fVar172 + fVar204;
        fVar155 = fVar189 + fVar230;
        fVar157 = fVar192 + fVar284;
        fVar158 = fVar194 + fVar296;
        fVar191 = fVar326 - fVar121;
        fVar206 = fVar329 - fVar156;
        fVar281 = fVar333 - fVar169;
        fVar289 = fVar337 - fVar188;
        fVar297 = fVar173 - fVar272;
        fVar299 = fVar190 - fVar282;
        fVar309 = fVar193 - fVar285;
        fVar313 = fVar195 - fVar287;
        uVar75 = -(uint)(0.0 < (fVar191 * (fVar122 - fVar297) - fVar297 * (fVar273 - fVar191)) * 0.0
                               + (fVar297 * (fVar120 - fVar117) - (fVar122 - fVar297) * fVar117) *
                                 0.0 + ((fVar273 - fVar191) * fVar117 -
                                       (fVar120 - fVar117) * fVar191));
        uVar72 = -(uint)(0.0 < (fVar206 * (fVar155 - fVar299) - fVar299 * (fVar283 - fVar206)) * 0.0
                               + (fVar299 * (fVar330 - fVar154) - (fVar155 - fVar299) * fVar154) *
                                 0.0 + ((fVar283 - fVar206) * fVar154 -
                                       (fVar330 - fVar154) * fVar206));
        uVar74 = -(uint)(0.0 < (fVar281 * (fVar157 - fVar309) - fVar309 * (fVar286 - fVar281)) * 0.0
                               + (fVar309 * (fVar334 - fVar159) - (fVar157 - fVar309) * fVar159) *
                                 0.0 + ((fVar286 - fVar281) * fVar159 -
                                       (fVar334 - fVar159) * fVar281));
        uVar76 = -(uint)(0.0 < (fVar289 * (fVar158 - fVar313) - fVar313 * (fVar288 - fVar289)) * 0.0
                               + (fVar313 * (fVar338 - fVar171) - (fVar158 - fVar313) * fVar171) *
                                 0.0 + ((fVar288 - fVar289) * fVar171 -
                                       (fVar338 - fVar171) * fVar289));
        fVar319 = (float)((uint)(fVar242 - fVar243) & uVar75 | ~uVar75 & (uint)(local_338 + fVar319)
                         );
        fVar320 = (float)((uint)(fVar251 - fVar252) & uVar72 |
                         ~uVar72 & (uint)(fStack_334 + fVar320));
        fVar310 = (float)((uint)(fVar254 - fVar255) & uVar74 |
                         ~uVar74 & (uint)(fStack_330 + fVar310));
        fVar118 = (float)((uint)(fVar256 - fVar257) & uVar76 |
                         ~uVar76 & (uint)(fStack_32c + fVar118));
        fVar256 = (float)((uint)(fVar232 - fVar298) & uVar75 | ~uVar75 & (uint)(fVar326 + fVar121));
        fVar326 = (float)((uint)(fVar237 - fVar308) & uVar72 | ~uVar72 & (uint)(fVar329 + fVar156));
        fVar329 = (float)((uint)(fVar239 - fVar311) & uVar74 | ~uVar74 & (uint)(fVar333 + fVar169));
        fVar333 = (float)((uint)(fVar240 - fVar318) & uVar76 | ~uVar76 & (uint)(fVar337 + fVar188));
        fVar172 = (float)((uint)(fVar172 - fVar204) & uVar75 | ~uVar75 & (uint)(fVar173 + fVar272));
        fVar173 = (float)((uint)(fVar189 - fVar230) & uVar72 | ~uVar72 & (uint)(fVar190 + fVar282));
        fVar189 = (float)((uint)(fVar192 - fVar284) & uVar74 | ~uVar74 & (uint)(fVar193 + fVar285));
        fVar190 = (float)((uint)(fVar194 - fVar296) & uVar76 | ~uVar76 & (uint)(fVar195 + fVar287));
        fVar121 = (float)((uint)fVar117 & uVar75 | ~uVar75 & (uint)fVar120);
        fVar156 = (float)((uint)fVar154 & uVar72 | ~uVar72 & (uint)fVar330);
        fVar169 = (float)((uint)fVar159 & uVar74 | ~uVar74 & (uint)fVar334);
        fVar188 = (float)((uint)fVar171 & uVar76 | ~uVar76 & (uint)fVar338);
        fVar204 = (float)((uint)fVar191 & uVar75 | ~uVar75 & (uint)fVar273);
        fVar230 = (float)((uint)fVar206 & uVar72 | ~uVar72 & (uint)fVar283);
        fVar284 = (float)((uint)fVar281 & uVar74 | ~uVar74 & (uint)fVar286);
        fVar296 = (float)((uint)fVar289 & uVar76 | ~uVar76 & (uint)fVar288);
        fVar298 = (float)((uint)fVar297 & uVar75 | ~uVar75 & (uint)fVar122);
        fVar308 = (float)((uint)fVar299 & uVar72 | ~uVar72 & (uint)fVar155);
        fVar311 = (float)((uint)fVar309 & uVar74 | ~uVar74 & (uint)fVar157);
        fVar318 = (float)((uint)fVar313 & uVar76 | ~uVar76 & (uint)fVar158);
        fVar120 = (float)((uint)fVar120 & uVar75 | ~uVar75 & (uint)fVar117) - fVar319;
        fVar232 = (float)((uint)fVar330 & uVar72 | ~uVar72 & (uint)fVar154) - fVar320;
        fVar237 = (float)((uint)fVar334 & uVar74 | ~uVar74 & (uint)fVar159) - fVar310;
        fVar239 = (float)((uint)fVar338 & uVar76 | ~uVar76 & (uint)fVar171) - fVar118;
        fVar240 = (float)((uint)fVar273 & uVar75 | ~uVar75 & (uint)fVar191) - fVar256;
        fVar242 = (float)((uint)fVar283 & uVar72 | ~uVar72 & (uint)fVar206) - fVar326;
        fVar251 = (float)((uint)fVar286 & uVar74 | ~uVar74 & (uint)fVar281) - fVar329;
        fVar254 = (float)((uint)fVar288 & uVar76 | ~uVar76 & (uint)fVar289) - fVar333;
        fVar297 = (float)((uint)fVar122 & uVar75 | ~uVar75 & (uint)fVar297) - fVar172;
        fVar299 = (float)((uint)fVar155 & uVar72 | ~uVar72 & (uint)fVar299) - fVar173;
        fVar309 = (float)((uint)fVar157 & uVar74 | ~uVar74 & (uint)fVar309) - fVar189;
        fVar313 = (float)((uint)fVar158 & uVar76 | ~uVar76 & (uint)fVar313) - fVar190;
        fVar273 = fVar319 - fVar121;
        fVar283 = fVar320 - fVar156;
        fVar286 = fVar310 - fVar169;
        fVar288 = fVar118 - fVar188;
        fVar191 = fVar256 - fVar204;
        fVar206 = fVar326 - fVar230;
        fVar281 = fVar329 - fVar284;
        fVar289 = fVar333 - fVar296;
        fVar117 = fVar172 - fVar298;
        fVar154 = fVar173 - fVar308;
        fVar159 = fVar189 - fVar311;
        fVar171 = fVar190 - fVar318;
        fVar330 = (fVar256 * fVar297 - fVar172 * fVar240) * 0.0 +
                  (fVar172 * fVar120 - fVar319 * fVar297) * 0.0 +
                  (fVar319 * fVar240 - fVar256 * fVar120);
        fVar334 = (fVar326 * fVar299 - fVar173 * fVar242) * 0.0 +
                  (fVar173 * fVar232 - fVar320 * fVar299) * 0.0 +
                  (fVar320 * fVar242 - fVar326 * fVar232);
        auVar179._4_4_ = fVar334;
        auVar179._0_4_ = fVar330;
        fVar337 = (fVar329 * fVar309 - fVar189 * fVar251) * 0.0 +
                  (fVar189 * fVar237 - fVar310 * fVar309) * 0.0 +
                  (fVar310 * fVar251 - fVar329 * fVar237);
        fVar338 = (fVar333 * fVar313 - fVar190 * fVar254) * 0.0 +
                  (fVar190 * fVar239 - fVar118 * fVar313) * 0.0 +
                  (fVar118 * fVar254 - fVar333 * fVar239);
        auVar321._0_4_ =
             (fVar204 * fVar117 - fVar298 * fVar191) * 0.0 +
             (fVar298 * fVar273 - fVar121 * fVar117) * 0.0 + (fVar121 * fVar191 - fVar204 * fVar273)
        ;
        auVar321._4_4_ =
             (fVar230 * fVar154 - fVar308 * fVar206) * 0.0 +
             (fVar308 * fVar283 - fVar156 * fVar154) * 0.0 + (fVar156 * fVar206 - fVar230 * fVar283)
        ;
        auVar321._8_4_ =
             (fVar284 * fVar159 - fVar311 * fVar281) * 0.0 +
             (fVar311 * fVar286 - fVar169 * fVar159) * 0.0 + (fVar169 * fVar281 - fVar284 * fVar286)
        ;
        auVar321._12_4_ =
             (fVar296 * fVar171 - fVar318 * fVar289) * 0.0 +
             (fVar318 * fVar288 - fVar188 * fVar171) * 0.0 + (fVar188 * fVar289 - fVar296 * fVar288)
        ;
        auVar179._8_4_ = fVar337;
        auVar179._12_4_ = fVar338;
        auVar80 = maxps(auVar179,auVar321);
        bVar52 = auVar80._0_4_ <= 0.0 && bVar52;
        auVar180._0_4_ = -(uint)bVar52;
        bVar53 = auVar80._4_4_ <= 0.0 && bVar53;
        auVar180._4_4_ = -(uint)bVar53;
        bVar51 = auVar80._8_4_ <= 0.0 && bVar51;
        auVar180._8_4_ = -(uint)bVar51;
        bVar50 = auVar80._12_4_ <= 0.0 && bVar50;
        auVar180._12_4_ = -(uint)bVar50;
        iVar55 = movmskps(iVar55,auVar180);
        if (iVar55 == 0) {
          auVar181._8_8_ = uStack_390;
          auVar181._0_8_ = local_398;
          iVar55 = 0;
        }
        else {
          auVar199._0_4_ = fVar117 * fVar240;
          auVar199._4_4_ = fVar154 * fVar242;
          auVar199._8_4_ = fVar159 * fVar251;
          auVar199._12_4_ = fVar171 * fVar254;
          fVar204 = fVar191 * fVar297 - auVar199._0_4_;
          fVar230 = fVar206 * fVar299 - auVar199._4_4_;
          fVar284 = fVar281 * fVar309 - auVar199._8_4_;
          fVar296 = fVar289 * fVar313 - auVar199._12_4_;
          fVar117 = fVar117 * fVar120 - fVar297 * fVar273;
          fVar154 = fVar154 * fVar232 - fVar299 * fVar283;
          fVar159 = fVar159 * fVar237 - fVar309 * fVar286;
          fVar171 = fVar171 * fVar239 - fVar313 * fVar288;
          fVar191 = fVar273 * fVar240 - fVar191 * fVar120;
          fVar206 = fVar283 * fVar242 - fVar206 * fVar232;
          fVar281 = fVar286 * fVar251 - fVar281 * fVar237;
          fVar289 = fVar288 * fVar254 - fVar289 * fVar239;
          auVar225._0_4_ = fVar204 * 0.0 + fVar117 * 0.0 + fVar191;
          auVar225._4_4_ = fVar230 * 0.0 + fVar154 * 0.0 + fVar206;
          auVar225._8_4_ = fVar284 * 0.0 + fVar159 * 0.0 + fVar281;
          auVar225._12_4_ = fVar296 * 0.0 + fVar171 * 0.0 + fVar289;
          auVar80 = rcpps(auVar199,auVar225);
          fVar121 = auVar80._0_4_;
          fVar156 = auVar80._4_4_;
          fVar169 = auVar80._8_4_;
          fVar188 = auVar80._12_4_;
          fVar121 = (1.0 - auVar225._0_4_ * fVar121) * fVar121 + fVar121;
          fVar156 = (1.0 - auVar225._4_4_ * fVar156) * fVar156 + fVar156;
          fVar169 = (1.0 - auVar225._8_4_ * fVar169) * fVar169 + fVar169;
          fVar188 = (1.0 - auVar225._12_4_ * fVar188) * fVar188 + fVar188;
          fVar191 = (fVar172 * fVar191 + fVar256 * fVar117 + fVar319 * fVar204) * fVar121;
          fVar154 = (fVar173 * fVar206 + fVar326 * fVar154 + fVar320 * fVar230) * fVar156;
          fVar159 = (fVar189 * fVar281 + fVar329 * fVar159 + fVar310 * fVar284) * fVar169;
          fVar171 = (fVar190 * fVar289 + fVar333 * fVar171 + fVar118 * fVar296) * fVar188;
          fVar117 = *(float *)(ray + k * 4 + 0x80);
          bVar52 = (fVar191 <= fVar117 && fVar170 <= fVar191) && bVar52;
          auVar101._0_4_ = -(uint)bVar52;
          bVar53 = (fVar154 <= fVar117 && fVar170 <= fVar154) && bVar53;
          auVar101._4_4_ = -(uint)bVar53;
          bVar51 = (fVar159 <= fVar117 && fVar170 <= fVar159) && bVar51;
          auVar101._8_4_ = -(uint)bVar51;
          bVar50 = (fVar171 <= fVar117 && fVar170 <= fVar171) && bVar50;
          auVar101._12_4_ = -(uint)bVar50;
          iVar55 = movmskps(iVar55,auVar101);
          if (iVar55 == 0) {
            auVar181._8_8_ = uStack_390;
            auVar181._0_8_ = local_398;
            iVar55 = 0;
          }
          else {
            auVar102._0_8_ =
                 CONCAT44(-(uint)(auVar225._4_4_ != 0.0 && bVar53),
                          -(uint)(auVar225._0_4_ != 0.0 && bVar52));
            auVar102._8_4_ = -(uint)(auVar225._8_4_ != 0.0 && bVar51);
            auVar102._12_4_ = -(uint)(auVar225._12_4_ != 0.0 && bVar50);
            iVar55 = movmskps(iVar55,auVar102);
            auVar181._8_8_ = uStack_390;
            auVar181._0_8_ = local_398;
            if (iVar55 != 0) {
              fVar330 = fVar330 * fVar121;
              fVar334 = fVar334 * fVar156;
              fVar337 = fVar337 * fVar169;
              fVar338 = fVar338 * fVar188;
              local_3f8 = (float)((uint)(1.0 - fVar330) & uVar75 | ~uVar75 & (uint)fVar330);
              fStack_3f4 = (float)((uint)(1.0 - fVar334) & uVar72 | ~uVar72 & (uint)fVar334);
              fStack_3f0 = (float)((uint)(1.0 - fVar337) & uVar74 | ~uVar74 & (uint)fVar337);
              fStack_3ec = (float)((uint)(1.0 - fVar338) & uVar76 | ~uVar76 & (uint)fVar338);
              local_278 = (float)(~uVar75 & (uint)(auVar321._0_4_ * fVar121) |
                                 (uint)(1.0 - auVar321._0_4_ * fVar121) & uVar75);
              fStack_274 = (float)(~uVar72 & (uint)(auVar321._4_4_ * fVar156) |
                                  (uint)(1.0 - auVar321._4_4_ * fVar156) & uVar72);
              fStack_270 = (float)(~uVar74 & (uint)(auVar321._8_4_ * fVar169) |
                                  (uint)(1.0 - auVar321._8_4_ * fVar169) & uVar74);
              fStack_26c = (float)(~uVar76 & (uint)(auVar321._12_4_ * fVar188) |
                                  (uint)(1.0 - auVar321._12_4_ * fVar188) & uVar76);
              auVar181._8_4_ = auVar102._8_4_;
              auVar181._0_8_ = auVar102._0_8_;
              auVar181._12_4_ = auVar102._12_4_;
              local_408 = fVar191;
              fStack_404 = fVar154;
              fStack_400 = fVar159;
              fStack_3fc = fVar171;
            }
          }
        }
        iVar55 = movmskps(iVar55,auVar181);
        fVar191 = local_348;
        fVar204 = fStack_344;
        fVar206 = fStack_340;
        fVar230 = fStack_33c;
        if (iVar55 != 0) {
          fVar117 = (auVar224._0_4_ - auVar305._0_4_) * local_3f8 + auVar305._0_4_;
          fVar121 = (auVar224._4_4_ - auVar305._4_4_) * fStack_3f4 + auVar305._4_4_;
          fVar154 = (auVar224._8_4_ - auVar305._8_4_) * fStack_3f0 + auVar305._8_4_;
          fVar156 = (auVar224._12_4_ - auVar305._12_4_) * fStack_3ec + auVar305._12_4_;
          fVar170 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
          auVar103._0_4_ = -(uint)(fVar170 * (fVar117 + fVar117) < local_408) & auVar181._0_4_;
          auVar103._4_4_ = -(uint)(fVar170 * (fVar121 + fVar121) < fStack_404) & auVar181._4_4_;
          auVar103._8_4_ = -(uint)(fVar170 * (fVar154 + fVar154) < fStack_400) & auVar181._8_4_;
          auVar103._12_4_ = -(uint)(fVar170 * (fVar156 + fVar156) < fStack_3fc) & auVar181._12_4_;
          iVar55 = movmskps((int)local_3b0,auVar103);
          if (iVar55 != 0) {
            local_278 = local_278 + local_278 + -1.0;
            fStack_274 = fStack_274 + fStack_274 + -1.0;
            fStack_270 = fStack_270 + fStack_270 + -1.0;
            fStack_26c = fStack_26c + fStack_26c + -1.0;
            local_1f8 = 0;
            local_1e8 = CONCAT44(fVar205,fVar196);
            uStack_1e0 = CONCAT44(fVar231,fVar229);
            local_1d8 = CONCAT44(fVar262,fVar253);
            uStack_1d0 = CONCAT44(fStack_28c,fVar269);
            local_1c8 = CONCAT44(fVar312,fVar270);
            uStack_1c0 = CONCAT44(fStack_29c,fVar258);
            local_1b8 = CONCAT44(fVar261,fVar260);
            uStack_1b0 = CONCAT44(fStack_27c,fVar271);
            local_228 = local_3f8;
            fStack_224 = fStack_3f4;
            fStack_220 = fStack_3f0;
            fStack_21c = fStack_3ec;
            local_218 = local_278;
            fStack_214 = fStack_274;
            fStack_210 = fStack_270;
            fStack_20c = fStack_26c;
            local_208 = local_408;
            fStack_204 = fStack_404;
            fStack_200 = fStack_400;
            fStack_1fc = fStack_3fc;
            local_1f4 = iVar19;
            local_1a8 = auVar103;
            if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar79 = 1.0 / fVar79;
              local_198[0] = fVar79 * (local_3f8 + 0.0);
              local_198[1] = fVar79 * (fStack_3f4 + 1.0);
              local_198[2] = fVar79 * (fStack_3f0 + 2.0);
              local_198[3] = fVar79 * (fStack_3ec + 3.0);
              local_188 = CONCAT44(fStack_274,local_278);
              uStack_180 = CONCAT44(fStack_26c,fStack_270);
              local_178[0] = local_408;
              local_178[1] = fStack_404;
              local_178[2] = fStack_400;
              local_178[3] = fStack_3fc;
              auVar138._0_4_ = auVar103._0_4_ & (uint)local_408;
              auVar138._4_4_ = auVar103._4_4_ & (uint)fStack_404;
              auVar138._8_4_ = auVar103._8_4_ & (uint)fStack_400;
              auVar138._12_4_ = auVar103._12_4_ & (uint)fStack_3fc;
              auVar162._0_8_ = CONCAT44(~auVar103._4_4_,~auVar103._0_4_) & 0x7f8000007f800000;
              auVar162._8_4_ = ~auVar103._8_4_ & 0x7f800000;
              auVar162._12_4_ = ~auVar103._12_4_ & 0x7f800000;
              auVar162 = auVar162 | auVar138;
              auVar182._4_4_ = auVar162._0_4_;
              auVar182._0_4_ = auVar162._4_4_;
              auVar182._8_4_ = auVar162._12_4_;
              auVar182._12_4_ = auVar162._8_4_;
              auVar80 = minps(auVar182,auVar162);
              auVar139._0_8_ = auVar80._8_8_;
              auVar139._8_4_ = auVar80._0_4_;
              auVar139._12_4_ = auVar80._4_4_;
              auVar80 = minps(auVar139,auVar80);
              auVar140._0_8_ =
                   CONCAT44(-(uint)(auVar80._4_4_ == auVar162._4_4_) & auVar103._4_4_,
                            -(uint)(auVar80._0_4_ == auVar162._0_4_) & auVar103._0_4_);
              auVar140._8_4_ = -(uint)(auVar80._8_4_ == auVar162._8_4_) & auVar103._8_4_;
              auVar140._12_4_ = -(uint)(auVar80._12_4_ == auVar162._12_4_) & auVar103._12_4_;
              iVar55 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar140);
              auVar104 = auVar103;
              if (iVar55 != 0) {
                auVar104._8_4_ = auVar140._8_4_;
                auVar104._0_8_ = auVar140._0_8_;
                auVar104._12_4_ = auVar140._12_4_;
              }
              uVar75 = movmskps(iVar55,auVar104);
              lVar67 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                }
              }
              local_3d8 = auVar103;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar170 = local_198[lVar67];
                uVar62 = *(undefined4 *)((long)&local_188 + lVar67 * 4);
                fVar79 = 1.0 - fVar170;
                fVar121 = fVar170 * fVar79 + fVar170 * fVar79;
                fVar117 = fVar79 * fVar79 * -3.0;
                fVar154 = (fVar79 * fVar79 - fVar121) * 3.0;
                fVar79 = (fVar121 - fVar170 * fVar170) * 3.0;
                fVar121 = fVar170 * fVar170 * 3.0;
                *(float *)(ray + k * 4 + 0x80) = local_178[lVar67];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar117 * fVar196 + fVar154 * fVar253 + fVar79 * fVar270 + fVar121 * fVar260;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar117 * fVar205 + fVar154 * fVar262 + fVar79 * fVar312 + fVar121 * fVar261;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar117 * fVar229 + fVar154 * fVar269 + fVar79 * fVar258 + fVar121 * fVar271;
                *(float *)(ray + k * 4 + 0xf0) = fVar170;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar62;
                *(uint *)(ray + k * 4 + 0x110) = uVar73;
                *(uint *)(ray + k * 4 + 0x120) = uVar71;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pRVar64 = (RTCIntersectArguments *)context;
              }
              else {
                local_4f8 = CONCAT44(uVar71,uVar71);
                uStack_4f0._0_4_ = uVar71;
                uStack_4f0._4_4_ = uVar71;
                local_4b8 = CONCAT44(uVar73,uVar73);
                uStack_4b0._0_4_ = uVar73;
                uStack_4b0._4_4_ = uVar73;
                local_328 = *local_2c8;
                uStack_320 = local_2c8[1];
                do {
                  local_e8 = local_198[lVar67];
                  uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = *(undefined4 *)((long)&local_188 + lVar67 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_178[lVar67];
                  fVar170 = 1.0 - local_e8;
                  fVar117 = local_e8 * fVar170 + local_e8 * fVar170;
                  fVar121 = (fVar117 - local_e8 * local_e8) * 3.0;
                  fVar79 = local_e8 * local_e8 * 3.0;
                  fVar117 = (fVar170 * fVar170 - fVar117) * 3.0;
                  local_378.context = context->user;
                  fVar170 = fVar170 * fVar170 * -3.0;
                  local_118._0_4_ =
                       fVar170 * fVar196 + fVar117 * fVar253 + fVar121 * fVar270 + fVar79 * fVar260;
                  local_108 = fVar170 * fVar205 +
                              fVar117 * fVar262 + fVar121 * fVar312 + fVar79 * fVar261;
                  local_f8 = fVar170 * fVar229 +
                             fVar117 * fVar269 + fVar121 * fVar258 + fVar79 * fVar271;
                  local_118._4_4_ = local_118._0_4_;
                  local_118._8_4_ = local_118._0_4_;
                  fStack_10c = (float)local_118._0_4_;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_4b8;
                  uStack_c0 = uStack_4b0;
                  local_b8 = local_4f8;
                  uStack_b0 = uStack_4f0;
                  local_a8 = (local_378.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_378.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_3c8 = local_328;
                  uStack_3c0 = uStack_320;
                  local_378.valid = (int *)&local_3c8;
                  pRVar64 = (RTCIntersectArguments *)pGVar20->userPtr;
                  local_378.hit = (RTCHitN *)local_118;
                  local_378.N = 4;
                  p_Var58 = pGVar20->intersectionFilterN;
                  auVar341._8_8_ = pGVar66;
                  auVar341._0_8_ = p_Var58;
                  local_378.geometryUserPtr = pRVar64;
                  local_378.ray = (RTCRayN *)ray;
                  if (p_Var58 != (RTCFilterFunctionN)0x0) {
                    auVar341 = (*p_Var58)(&local_378);
                  }
                  pGVar66 = auVar341._8_8_;
                  auVar111._0_4_ = -(uint)((int)local_3c8 == 0);
                  auVar111._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar111._8_4_ = -(uint)((int)uStack_3c0 == 0);
                  auVar111._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                  uVar75 = movmskps(auVar341._0_4_,auVar111);
                  pRVar59 = (RayHitK<4> *)(ulong)(uVar75 ^ 0xf);
                  if ((uVar75 ^ 0xf) == 0) {
                    auVar111 = auVar111 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar64 = context->args;
                    pRVar60 = (RTCIntersectArguments *)pRVar64->filter;
                    auVar54._8_8_ = pGVar66;
                    auVar54._0_8_ = pRVar60;
                    auVar342._8_8_ = pGVar66;
                    auVar342._0_8_ = pRVar60;
                    if ((pRVar60 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar64->flags & 2) != 0 ||
                        (auVar342 = auVar54, ((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar342 = (*(code *)pRVar60)(&local_378);
                    }
                    pGVar66 = auVar342._8_8_;
                    auVar150._0_4_ = -(uint)((int)local_3c8 == 0);
                    auVar150._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar150._8_4_ = -(uint)((int)uStack_3c0 == 0);
                    auVar150._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                    auVar111 = auVar150 ^ _DAT_01febe20;
                    uVar75 = movmskps(auVar342._0_4_,auVar150);
                    pRVar59 = (RayHitK<4> *)(ulong)(uVar75 ^ 0xf);
                    if ((uVar75 ^ 0xf) != 0) {
                      RVar25 = *(RTCFeatureFlags *)((long)local_378.hit + 4);
                      uVar75 = *(uint *)((long)local_378.hit + 8);
                      uVar72 = *(uint *)((long)((long)local_378.hit + 8) + 4);
                      *(uint *)(local_378.ray + 0xc0) =
                           ~auVar150._0_4_ & *(uint *)&(local_378.hit)->field_0x0 |
                           *(uint *)(local_378.ray + 0xc0) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xc4) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xc4) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 200) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 200) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0xcc) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0xcc) & auVar150._12_4_;
                      RVar25 = *(RTCFeatureFlags *)((long)((long)local_378.hit + 0x10) + 4);
                      uVar75 = *(uint *)((long)local_378.hit + 0x18);
                      uVar72 = *(uint *)((long)((long)local_378.hit + 0x18) + 4);
                      *(uint *)(local_378.ray + 0xd0) =
                           ~auVar150._0_4_ & *(uint *)((long)local_378.hit + 0x10) |
                           *(uint *)(local_378.ray + 0xd0) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xd4) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xd4) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 0xd8) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 0xd8) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0xdc) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0xdc) & auVar150._12_4_;
                      RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->feature_mask
                      ;
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                         context;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0xe0) =
                           ~auVar150._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->flags |
                           *(uint *)(local_378.ray + 0xe0) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xe4) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xe4) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 0xe8) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 0xe8) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0xec) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0xec) & auVar150._12_4_;
                      RVar25 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                        filter + 4);
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                         intersect;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x20))->intersect + 4);
                      *(uint *)(local_378.ray + 0xf0) =
                           ~auVar150._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->filter
                           | *(uint *)(local_378.ray + 0xf0) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xf4) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xf4) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 0xf8) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 0xf8) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0xfc) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0xfc) & auVar150._12_4_;
                      RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->feature_mask
                      ;
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                         context;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0x100) =
                           ~auVar150._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->flags |
                           *(uint *)(local_378.ray + 0x100) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0x104) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0x104) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 0x108) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 0x108) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0x10c) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0x10c) & auVar150._12_4_;
                      RVar25 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                        filter + 4);
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                         intersect;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x40))->intersect + 4);
                      *(uint *)(local_378.ray + 0x110) =
                           *(uint *)(local_378.ray + 0x110) & auVar150._0_4_ |
                           ~auVar150._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->filter
                      ;
                      *(RTCFeatureFlags *)(local_378.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_378.ray + 0x114) & auVar150._4_4_ |
                           ~auVar150._4_4_ & RVar25;
                      *(uint *)(local_378.ray + 0x118) =
                           *(uint *)(local_378.ray + 0x118) & auVar150._8_4_ |
                           ~auVar150._8_4_ & uVar75;
                      *(uint *)(local_378.ray + 0x11c) =
                           *(uint *)(local_378.ray + 0x11c) & auVar150._12_4_ |
                           ~auVar150._12_4_ & uVar72;
                      RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->feature_mask
                      ;
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                         context;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0x120) =
                           *(uint *)(local_378.ray + 0x120) & auVar150._0_4_ |
                           ~auVar150._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_378.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_378.ray + 0x124) & auVar150._4_4_ |
                           ~auVar150._4_4_ & RVar25;
                      *(uint *)(local_378.ray + 0x128) =
                           *(uint *)(local_378.ray + 0x128) & auVar150._8_4_ |
                           ~auVar150._8_4_ & uVar75;
                      *(uint *)(local_378.ray + 300) =
                           *(uint *)(local_378.ray + 300) & auVar150._12_4_ |
                           ~auVar150._12_4_ & uVar72;
                      RVar25 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                        filter + 4);
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                         intersect;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x60))->intersect + 4);
                      *(uint *)(local_378.ray + 0x130) =
                           ~auVar150._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->filter
                           | *(uint *)(local_378.ray + 0x130) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0x134) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0x134) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 0x138) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 0x138) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0x13c) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0x13c) & auVar150._12_4_;
                      RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x80))->feature_mask
                      ;
                      uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x80))->
                                         context;
                      uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x80))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0x140) =
                           ~auVar150._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x80))->flags |
                           *(uint *)(local_378.ray + 0x140) & auVar150._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0x144) =
                           ~auVar150._4_4_ & RVar25 |
                           *(RTCFeatureFlags *)(local_378.ray + 0x144) & auVar150._4_4_;
                      *(uint *)(local_378.ray + 0x148) =
                           ~auVar150._8_4_ & uVar75 |
                           *(uint *)(local_378.ray + 0x148) & auVar150._8_4_;
                      *(uint *)(local_378.ray + 0x14c) =
                           ~auVar150._12_4_ & uVar72 |
                           *(uint *)(local_378.ray + 0x14c) & auVar150._12_4_;
                      pRVar59 = (RayHitK<4> *)local_378.ray;
                      pRVar64 = (RTCIntersectArguments *)local_378.hit;
                    }
                  }
                  auVar112._0_4_ = auVar111._0_4_ << 0x1f;
                  auVar112._4_4_ = auVar111._4_4_ << 0x1f;
                  auVar112._8_4_ = auVar111._8_4_ << 0x1f;
                  auVar112._12_4_ = auVar111._12_4_ << 0x1f;
                  iVar55 = movmskps((int)pRVar59,auVar112);
                  if (iVar55 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar62;
                  }
                  *(undefined4 *)(local_3d8 + lVar67 * 4) = 0;
                  fVar170 = *(float *)(ray + k * 4 + 0x80);
                  local_3d8._0_4_ = -(uint)(local_408 <= fVar170) & local_3d8._0_4_;
                  local_3d8._4_4_ = -(uint)(fStack_404 <= fVar170) & local_3d8._4_4_;
                  local_3d8._8_4_ = -(uint)(fStack_400 <= fVar170) & local_3d8._8_4_;
                  local_3d8._12_4_ = -(uint)(fStack_3fc <= fVar170) & local_3d8._12_4_;
                  iVar55 = movmskps(iVar55,local_3d8);
                  if (iVar55 != 0) {
                    auVar151._0_4_ = local_3d8._0_4_ & (uint)local_408;
                    auVar151._4_4_ = local_3d8._4_4_ & (uint)fStack_404;
                    auVar151._8_4_ = local_3d8._8_4_ & (uint)fStack_400;
                    auVar151._12_4_ = local_3d8._12_4_ & (uint)fStack_3fc;
                    auVar168._0_8_ =
                         CONCAT44(~local_3d8._4_4_,~local_3d8._0_4_) & 0x7f8000007f800000;
                    auVar168._8_4_ = ~local_3d8._8_4_ & 0x7f800000;
                    auVar168._12_4_ = ~local_3d8._12_4_ & 0x7f800000;
                    auVar168 = auVar168 | auVar151;
                    auVar187._4_4_ = auVar168._0_4_;
                    auVar187._0_4_ = auVar168._4_4_;
                    auVar187._8_4_ = auVar168._12_4_;
                    auVar187._12_4_ = auVar168._8_4_;
                    auVar80 = minps(auVar187,auVar168);
                    auVar152._0_8_ = auVar80._8_8_;
                    auVar152._8_4_ = auVar80._0_4_;
                    auVar152._12_4_ = auVar80._4_4_;
                    auVar80 = minps(auVar152,auVar80);
                    auVar153._0_8_ =
                         CONCAT44(-(uint)(auVar80._4_4_ == auVar168._4_4_) & local_3d8._4_4_,
                                  -(uint)(auVar80._0_4_ == auVar168._0_4_) & local_3d8._0_4_);
                    auVar153._8_4_ = -(uint)(auVar80._8_4_ == auVar168._8_4_) & local_3d8._8_4_;
                    auVar153._12_4_ = -(uint)(auVar80._12_4_ == auVar168._12_4_) & local_3d8._12_4_;
                    iVar61 = movmskps((int)pRVar64,auVar153);
                    auVar113 = local_3d8;
                    if (iVar61 != 0) {
                      auVar113._8_4_ = auVar153._8_4_;
                      auVar113._0_8_ = auVar153._0_8_;
                      auVar113._12_4_ = auVar153._12_4_;
                    }
                    uVar62 = movmskps(iVar61,auVar113);
                    pRVar64 = (RTCIntersectArguments *)
                              CONCAT44((int)((ulong)pRVar64 >> 0x20),uVar62);
                    lVar67 = 0;
                    if (pRVar64 != (RTCIntersectArguments *)0x0) {
                      for (; ((ulong)pRVar64 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                      }
                    }
                  }
                } while ((char)iVar55 != '\0');
              }
              iVar61 = (int)pRVar64;
              prim = local_2c0;
              fVar191 = local_348;
              fVar204 = fStack_344;
              fVar206 = fStack_340;
              fVar230 = fStack_33c;
            }
          }
        }
      }
      fStack_33c = fVar230;
      fStack_340 = fVar206;
      fStack_344 = fVar204;
      local_348 = fVar191;
      if (4 < iVar19) {
        local_58 = iVar19;
        iStack_54 = iVar19;
        iStack_50 = iVar19;
        iStack_4c = iVar19;
        local_388._4_4_ = local_388._0_4_;
        fStack_380 = (float)local_388._0_4_;
        fStack_37c = (float)local_388._0_4_;
        local_68 = 1.0 / (float)local_2b8._0_4_;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        local_78 = uVar71;
        uStack_74 = uVar71;
        uStack_70 = uVar71;
        uStack_6c = uVar71;
        local_88 = uVar73;
        uStack_84 = uVar73;
        uStack_80 = uVar73;
        uStack_7c = uVar73;
        lVar67 = 4;
        do {
          fVar298 = fStack_280;
          fVar297 = fStack_284;
          fVar296 = local_288;
          fVar289 = fStack_290;
          fVar284 = fStack_294;
          fVar281 = local_298;
          fVar271 = fStack_2a0;
          fVar261 = fStack_2a4;
          fVar260 = local_2a8;
          uVar72 = (uint)lVar67;
          pRVar64 = (RTCIntersectArguments *)(bezier_basis0 + lVar23);
          pfVar1 = (float *)((long)&pRVar64->flags + lVar67 * 4);
          fVar170 = *pfVar1;
          fVar79 = pfVar1[1];
          fVar117 = pfVar1[2];
          fVar121 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2227768 + lVar67 * 4);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2227bec + lVar67 * 4);
          local_258 = *pfVar1;
          fStack_254 = pfVar1[1];
          fStack_250 = pfVar1[2];
          fStack_24c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2228070 + lVar67 * 4);
          local_338 = *pfVar1;
          fStack_334 = pfVar1[1];
          fStack_330 = pfVar1[2];
          fStack_32c = pfVar1[3];
          fVar329 = local_128 * fVar170 +
                    fVar236 * local_348 + fVar250 * local_258 + fVar116 * local_338;
          fVar330 = fStack_124 * fVar79 +
                    fVar236 * fStack_344 + fVar250 * fStack_254 + fVar116 * fStack_334;
          fVar333 = fStack_120 * fVar117 +
                    fVar236 * fStack_340 + fVar250 * fStack_250 + fVar116 * fStack_330;
          fVar334 = fStack_11c * fVar121 +
                    fVar236 * fStack_33c + fVar250 * fStack_24c + fVar116 * fStack_32c;
          fVar337 = local_248 * fVar170 +
                    fVar238 * local_348 + local_2d8 * local_258 + local_2e8 * local_338;
          fVar338 = fStack_244 * fVar79 +
                    fVar238 * fStack_344 + fStack_2d4 * fStack_254 + fStack_2e4 * fStack_334;
          fVar273 = fStack_240 * fVar117 +
                    fVar238 * fStack_340 + fStack_2d0 * fStack_250 + fStack_2e0 * fStack_330;
          fVar283 = fStack_23c * fVar121 +
                    fVar238 * fStack_33c + fStack_2cc * fStack_24c + fStack_2dc * fStack_32c;
          auVar142._0_4_ =
               local_168 * fVar170 +
               local_158 * local_348 + local_138 * local_258 + local_148 * local_338;
          auVar142._4_4_ =
               fStack_164 * fVar79 +
               fStack_154 * fStack_344 + fStack_134 * fStack_254 + fStack_144 * fStack_334;
          auVar142._8_4_ =
               fStack_160 * fVar117 +
               fStack_150 * fStack_340 + fStack_130 * fStack_250 + fStack_140 * fStack_330;
          auVar142._12_4_ =
               fStack_15c * fVar121 +
               fStack_14c * fStack_33c + fStack_12c * fStack_24c + fStack_13c * fStack_32c;
          pfVar1 = (float *)(bezier_basis1 + lVar23 + lVar67 * 4);
          fVar154 = *pfVar1;
          fVar156 = pfVar1[1];
          fVar159 = pfVar1[2];
          fVar169 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2229b88 + lVar67 * 4);
          fVar171 = *pfVar1;
          fVar188 = pfVar1[1];
          fVar191 = pfVar1[2];
          fVar204 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x222a00c + lVar67 * 4);
          fVar206 = *pfVar1;
          fVar230 = pfVar1[1];
          fVar253 = pfVar1[2];
          fVar262 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x222a490 + lVar67 * 4);
          fVar269 = *pfVar1;
          fVar270 = pfVar1[1];
          fVar312 = pfVar1[2];
          fVar258 = pfVar1[3];
          fVar310 = local_128 * fVar154 + fVar236 * fVar171 + fVar250 * fVar206 + fVar116 * fVar269;
          fVar120 = fStack_124 * fVar156 + fVar236 * fVar188 + fVar250 * fVar230 + fVar116 * fVar270
          ;
          fVar237 = fStack_120 * fVar159 + fVar236 * fVar191 + fVar250 * fVar253 + fVar116 * fVar312
          ;
          fVar240 = fStack_11c * fVar169 + fVar236 * fVar204 + fVar250 * fVar262 + fVar116 * fVar258
          ;
          fVar251 = local_248 * fVar154 +
                    fVar238 * fVar171 + local_2d8 * fVar206 + local_2e8 * fVar269;
          fVar254 = fStack_244 * fVar156 +
                    fVar238 * fVar188 + fStack_2d4 * fVar230 + fStack_2e4 * fVar270;
          fVar256 = fStack_240 * fVar159 +
                    fVar238 * fVar191 + fStack_2d0 * fVar253 + fStack_2e0 * fVar312;
          fVar326 = fStack_23c * fVar169 +
                    fVar238 * fVar204 + fStack_2cc * fVar262 + fStack_2dc * fVar258;
          auVar322._0_4_ =
               local_168 * fVar154 + local_158 * fVar171 + local_138 * fVar206 + local_148 * fVar269
          ;
          auVar322._4_4_ =
               fStack_164 * fVar156 +
               fStack_154 * fVar188 + fStack_134 * fVar230 + fStack_144 * fVar270;
          auVar322._8_4_ =
               fStack_160 * fVar159 +
               fStack_150 * fVar191 + fStack_130 * fVar253 + fStack_140 * fVar312;
          auVar322._12_4_ =
               fStack_15c * fVar169 +
               fStack_14c * fVar204 + fStack_12c * fVar262 + fStack_13c * fVar258;
          fVar118 = fVar310 - fVar329;
          fVar232 = fVar120 - fVar330;
          fVar239 = fVar237 - fVar333;
          fVar242 = fVar240 - fVar334;
          fVar313 = fVar251 - fVar337;
          fVar318 = fVar254 - fVar338;
          fVar319 = fVar256 - fVar273;
          fVar320 = fVar326 - fVar283;
          local_328 = CONCAT44(fVar338,fVar337);
          uStack_320 = CONCAT44(fVar283,fVar273);
          fVar299 = fVar337 * fVar118 - fVar329 * fVar313;
          fVar308 = fVar338 * fVar232 - fVar330 * fVar318;
          fVar309 = fVar273 * fVar239 - fVar333 * fVar319;
          fVar311 = fVar283 * fVar242 - fVar334 * fVar320;
          auVar80 = maxps(auVar142,auVar322);
          bVar52 = fVar299 * fVar299 <=
                   auVar80._0_4_ * auVar80._0_4_ * (fVar118 * fVar118 + fVar313 * fVar313) &&
                   (int)uVar72 < local_58;
          auVar249._0_4_ = -(uint)bVar52;
          bVar53 = fVar308 * fVar308 <=
                   auVar80._4_4_ * auVar80._4_4_ * (fVar232 * fVar232 + fVar318 * fVar318) &&
                   (int)(uVar72 | 1) < iStack_54;
          auVar249._4_4_ = -(uint)bVar53;
          bVar51 = fVar309 * fVar309 <=
                   auVar80._8_4_ * auVar80._8_4_ * (fVar239 * fVar239 + fVar319 * fVar319) &&
                   (int)(uVar72 | 2) < iStack_50;
          auVar249._8_4_ = -(uint)bVar51;
          bVar50 = fVar311 * fVar311 <=
                   auVar80._12_4_ * auVar80._12_4_ * (fVar242 * fVar242 + fVar320 * fVar320) &&
                   (int)(uVar72 | 3) < iStack_4c;
          auVar249._12_4_ = -(uint)bVar50;
          uVar75 = movmskps((int)pGVar66,auVar249);
          pGVar66 = (Geometry *)(ulong)uVar75;
          fVar299 = local_3a8;
          fVar308 = fStack_3a4;
          fVar309 = fStack_3a0;
          fVar311 = fStack_39c;
          if (uVar75 != 0) {
            local_2b8._4_4_ = fVar232;
            local_2b8._0_4_ = fVar118;
            fStack_2b0 = fVar239;
            fStack_2ac = fVar242;
            fVar189 = fVar269 * local_318 + fVar206 * local_308 + fVar171 * local_2f8 +
                      fVar154 * fVar241;
            fVar190 = fVar270 * fStack_314 + fVar230 * fStack_304 + fVar188 * fStack_2f4 +
                      fVar156 * fVar241;
            fVar192 = fVar312 * fStack_310 + fVar253 * fStack_300 + fVar191 * fStack_2f0 +
                      fVar159 * fVar241;
            fVar193 = fVar258 * fStack_30c + fVar262 * fStack_2fc + fVar204 * fStack_2ec +
                      fVar169 * fVar241;
            fVar255 = local_338 * local_318 + local_258 * local_308 + local_348 * local_2f8 +
                      fVar170 * fVar241;
            fVar257 = fStack_334 * fStack_314 + fStack_254 * fStack_304 + fStack_344 * fStack_2f4 +
                      fVar79 * fVar241;
            fVar272 = fStack_330 * fStack_310 + fStack_250 * fStack_300 + fStack_340 * fStack_2f0 +
                      fVar117 * fVar241;
            fVar282 = fStack_32c * fStack_30c + fStack_24c * fStack_2fc + fStack_33c * fStack_2ec +
                      fVar121 * fVar241;
            pfVar1 = (float *)(lVar23 + 0x22284f4 + lVar67 * 4);
            fVar170 = *pfVar1;
            fVar79 = pfVar1[1];
            fVar117 = pfVar1[2];
            fVar121 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x2228978 + lVar67 * 4);
            fVar154 = *pfVar1;
            fVar156 = pfVar1[1];
            fVar159 = pfVar1[2];
            fVar169 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x2228dfc + lVar67 * 4);
            fVar171 = *pfVar1;
            fVar188 = pfVar1[1];
            fVar191 = pfVar1[2];
            fVar204 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x2229280 + lVar67 * 4);
            fVar206 = *pfVar1;
            fVar230 = pfVar1[1];
            fVar253 = pfVar1[2];
            fVar262 = pfVar1[3];
            fVar285 = local_128 * fVar170 +
                      fVar236 * fVar154 + fVar250 * fVar171 + fVar116 * fVar206;
            fVar287 = fStack_124 * fVar79 +
                      fVar236 * fVar156 + fVar250 * fVar188 + fVar116 * fVar230;
            fVar327 = fStack_120 * fVar117 +
                      fVar236 * fVar159 + fVar250 * fVar191 + fVar116 * fVar253;
            fVar331 = fStack_11c * fVar121 +
                      fVar236 * fVar169 + fVar250 * fVar204 + fVar116 * fVar262;
            fVar194 = local_248 * fVar170 +
                      fVar238 * fVar154 + local_2d8 * fVar171 + local_2e8 * fVar206;
            fVar195 = fStack_244 * fVar79 +
                      fVar238 * fVar156 + fStack_2d4 * fVar188 + fStack_2e4 * fVar230;
            fVar243 = fStack_240 * fVar117 +
                      fVar238 * fVar159 + fStack_2d0 * fVar191 + fStack_2e0 * fVar253;
            fVar252 = fStack_23c * fVar121 +
                      fVar238 * fVar169 + fStack_2cc * fVar204 + fStack_2dc * fVar262;
            pfVar1 = (float *)(lVar23 + 0x222a914 + lVar67 * 4);
            fVar269 = *pfVar1;
            fVar270 = pfVar1[1];
            fVar312 = pfVar1[2];
            fVar258 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x222b21c + lVar67 * 4);
            fVar299 = *pfVar1;
            fVar308 = pfVar1[1];
            fVar309 = pfVar1[2];
            fVar311 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x222b6a0 + lVar67 * 4);
            fVar286 = *pfVar1;
            fVar288 = pfVar1[1];
            fVar122 = pfVar1[2];
            fVar155 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x222ad98 + lVar67 * 4);
            fVar157 = *pfVar1;
            fVar158 = pfVar1[1];
            fVar172 = pfVar1[2];
            fVar173 = pfVar1[3];
            fVar335 = local_128 * fVar269 +
                      fVar236 * fVar157 + fVar250 * fVar299 + fVar116 * fVar286;
            fVar339 = fStack_124 * fVar270 +
                      fVar236 * fVar158 + fVar250 * fVar308 + fVar116 * fVar288;
            fVar324 = fStack_120 * fVar312 +
                      fVar236 * fVar172 + fVar250 * fVar309 + fVar116 * fVar122;
            fVar325 = fStack_11c * fVar258 +
                      fVar236 * fVar173 + fVar250 * fVar311 + fVar116 * fVar155;
            fVar328 = local_248 * fVar269 +
                      fVar238 * fVar157 + local_2d8 * fVar299 + local_2e8 * fVar286;
            fVar332 = fStack_244 * fVar270 +
                      fVar238 * fVar158 + fStack_2d4 * fVar308 + fStack_2e4 * fVar288;
            fVar336 = fStack_240 * fVar312 +
                      fVar238 * fVar172 + fStack_2d0 * fVar309 + fStack_2e0 * fVar122;
            fVar340 = fStack_23c * fVar258 +
                      fVar238 * fVar173 + fStack_2cc * fVar311 + fStack_2dc * fVar155;
            auVar307._0_8_ = CONCAT44(fVar287,fVar285) & 0x7fffffff7fffffff;
            auVar307._8_4_ = ABS(fVar327);
            auVar307._12_4_ = ABS(fVar331);
            auVar226._0_8_ = CONCAT44(fVar195,fVar194) & 0x7fffffff7fffffff;
            auVar226._8_4_ = ABS(fVar243);
            auVar226._12_4_ = ABS(fVar252);
            auVar80 = maxps(auVar307,auVar226);
            auVar316._0_8_ =
                 CONCAT44(fVar79 * fVar241 +
                          fVar156 * fStack_2f4 + fVar188 * fStack_304 + fVar230 * fStack_314,
                          fVar170 * fVar241 +
                          fVar154 * local_2f8 + fVar171 * local_308 + fVar206 * local_318) &
                 0x7fffffff7fffffff;
            auVar316._8_4_ =
                 ABS(fVar117 * fVar241 +
                     fVar159 * fStack_2f0 + fVar191 * fStack_300 + fVar253 * fStack_310);
            auVar316._12_4_ =
                 ABS(fVar121 * fVar241 +
                     fVar169 * fStack_2ec + fVar204 * fStack_2fc + fVar262 * fStack_30c);
            auVar80 = maxps(auVar80,auVar316);
            uVar75 = -(uint)(local_438 <= auVar80._0_4_);
            uVar74 = -(uint)(local_438 <= auVar80._4_4_);
            uVar76 = -(uint)(local_438 <= auVar80._8_4_);
            uVar77 = -(uint)(local_438 <= auVar80._12_4_);
            auVar227._0_4_ = ~uVar75 & (uint)fVar118;
            auVar227._4_4_ = ~uVar74 & (uint)fVar232;
            auVar227._8_4_ = ~uVar76 & (uint)fVar239;
            auVar227._12_4_ = ~uVar77 & (uint)fVar242;
            auVar295._0_4_ = (uint)fVar285 & uVar75;
            auVar295._4_4_ = (uint)fVar287 & uVar74;
            auVar295._8_4_ = (uint)fVar327 & uVar76;
            auVar295._12_4_ = (uint)fVar331 & uVar77;
            auVar295 = auVar295 | auVar227;
            fVar194 = (float)(~uVar75 & (uint)fVar313 | (uint)fVar194 & uVar75);
            fVar195 = (float)(~uVar74 & (uint)fVar318 | (uint)fVar195 & uVar74);
            fVar243 = (float)(~uVar76 & (uint)fVar319 | (uint)fVar243 & uVar76);
            fVar252 = (float)(~uVar77 & (uint)fVar320 | (uint)fVar252 & uVar77);
            auVar317._0_8_ = CONCAT44(fVar339,fVar335) & 0x7fffffff7fffffff;
            auVar317._8_4_ = ABS(fVar324);
            auVar317._12_4_ = ABS(fVar325);
            auVar163._0_8_ = CONCAT44(fVar332,fVar328) & 0x7fffffff7fffffff;
            auVar163._8_4_ = ABS(fVar336);
            auVar163._12_4_ = ABS(fVar340);
            auVar80 = maxps(auVar317,auVar163);
            auVar105._0_8_ =
                 CONCAT44(fVar270 * fVar241 +
                          fVar158 * fStack_2f4 + fVar308 * fStack_304 + fVar288 * fStack_314,
                          fVar269 * fVar241 +
                          fVar157 * local_2f8 + fVar299 * local_308 + fVar286 * local_318) &
                 0x7fffffff7fffffff;
            auVar105._8_4_ =
                 ABS(fVar312 * fVar241 +
                     fVar172 * fStack_2f0 + fVar309 * fStack_300 + fVar122 * fStack_310);
            auVar105._12_4_ =
                 ABS(fVar258 * fVar241 +
                     fVar173 * fStack_2ec + fVar311 * fStack_2fc + fVar155 * fStack_30c);
            auVar80 = maxps(auVar80,auVar105);
            uVar75 = -(uint)(local_438 <= auVar80._0_4_);
            uVar74 = -(uint)(local_438 <= auVar80._4_4_);
            uVar76 = -(uint)(local_438 <= auVar80._8_4_);
            uVar77 = -(uint)(local_438 <= auVar80._12_4_);
            fVar122 = (float)((uint)fVar335 & uVar75 | ~uVar75 & (uint)fVar118);
            fVar155 = (float)((uint)fVar339 & uVar74 | ~uVar74 & (uint)fVar232);
            fVar157 = (float)((uint)fVar324 & uVar76 | ~uVar76 & (uint)fVar239);
            fVar158 = (float)((uint)fVar325 & uVar77 | ~uVar77 & (uint)fVar242);
            fVar299 = (float)(~uVar75 & (uint)fVar313 | (uint)fVar328 & uVar75);
            fVar309 = (float)(~uVar74 & (uint)fVar318 | (uint)fVar332 & uVar74);
            fVar313 = (float)(~uVar76 & (uint)fVar319 | (uint)fVar336 & uVar76);
            fVar319 = (float)(~uVar77 & (uint)fVar320 | (uint)fVar340 & uVar77);
            fVar169 = auVar295._0_4_;
            fVar170 = auVar295._4_4_;
            fVar79 = auVar295._8_4_;
            fVar117 = auVar295._12_4_;
            auVar200._0_4_ = fVar194 * fVar194 + fVar169 * fVar169;
            auVar200._4_4_ = fVar195 * fVar195 + fVar170 * fVar170;
            auVar200._8_4_ = fVar243 * fVar243 + fVar79 * fVar79;
            auVar200._12_4_ = fVar252 * fVar252 + fVar117 * fVar117;
            auVar80 = rsqrtps(auVar227,auVar200);
            fVar121 = auVar80._0_4_;
            fVar154 = auVar80._4_4_;
            fVar156 = auVar80._8_4_;
            fVar159 = auVar80._12_4_;
            auVar228._0_4_ = fVar121 * fVar121 * auVar200._0_4_ * 0.5 * fVar121;
            auVar228._4_4_ = fVar154 * fVar154 * auVar200._4_4_ * 0.5 * fVar154;
            auVar228._8_4_ = fVar156 * fVar156 * auVar200._8_4_ * 0.5 * fVar156;
            auVar228._12_4_ = fVar159 * fVar159 * auVar200._12_4_ * 0.5 * fVar159;
            fVar206 = fVar121 * 1.5 - auVar228._0_4_;
            fVar230 = fVar154 * 1.5 - auVar228._4_4_;
            fVar253 = fVar156 * 1.5 - auVar228._8_4_;
            fVar262 = fVar159 * 1.5 - auVar228._12_4_;
            auVar201._0_4_ = fVar299 * fVar299 + fVar122 * fVar122;
            auVar201._4_4_ = fVar309 * fVar309 + fVar155 * fVar155;
            auVar201._8_4_ = fVar313 * fVar313 + fVar157 * fVar157;
            auVar201._12_4_ = fVar319 * fVar319 + fVar158 * fVar158;
            auVar80 = rsqrtps(auVar228,auVar201);
            fVar121 = auVar80._0_4_;
            fVar154 = auVar80._4_4_;
            fVar156 = auVar80._8_4_;
            fVar159 = auVar80._12_4_;
            fVar171 = fVar121 * 1.5 - fVar121 * fVar121 * auVar201._0_4_ * 0.5 * fVar121;
            fVar188 = fVar154 * 1.5 - fVar154 * fVar154 * auVar201._4_4_ * 0.5 * fVar154;
            fVar191 = fVar156 * 1.5 - fVar156 * fVar156 * auVar201._8_4_ * 0.5 * fVar156;
            fVar204 = fVar159 * 1.5 - fVar159 * fVar159 * auVar201._12_4_ * 0.5 * fVar159;
            fVar308 = fVar194 * fVar206 * auVar142._0_4_;
            fVar311 = fVar195 * fVar230 * auVar142._4_4_;
            fVar318 = fVar243 * fVar253 * auVar142._8_4_;
            fVar320 = fVar252 * fVar262 * auVar142._12_4_;
            fVar154 = -fVar169 * fVar206 * auVar142._0_4_;
            fVar156 = -fVar170 * fVar230 * auVar142._4_4_;
            fVar159 = -fVar79 * fVar253 * auVar142._8_4_;
            fVar169 = -fVar117 * fVar262 * auVar142._12_4_;
            fVar269 = fVar206 * 0.0 * auVar142._0_4_;
            fVar270 = fVar230 * 0.0 * auVar142._4_4_;
            fVar312 = fVar253 * 0.0 * auVar142._8_4_;
            fVar258 = fVar262 * 0.0 * auVar142._12_4_;
            local_338 = fVar255 + fVar269;
            fStack_334 = fVar257 + fVar270;
            fStack_330 = fVar272 + fVar312;
            fStack_32c = fVar282 + fVar258;
            fVar118 = fVar299 * fVar171 * auVar322._0_4_;
            fVar232 = fVar309 * fVar188 * auVar322._4_4_;
            fVar243 = fVar313 * fVar191 * auVar322._8_4_;
            fVar252 = fVar319 * fVar204 * auVar322._12_4_;
            fVar239 = fVar310 + fVar118;
            fVar242 = fVar120 + fVar232;
            fVar286 = fVar237 + fVar243;
            fVar288 = fVar240 + fVar252;
            fVar170 = -fVar122 * fVar171 * auVar322._0_4_;
            fVar79 = -fVar155 * fVar188 * auVar322._4_4_;
            fVar117 = -fVar157 * fVar191 * auVar322._8_4_;
            fVar121 = -fVar158 * fVar204 * auVar322._12_4_;
            fVar122 = fVar251 + fVar170;
            fVar155 = fVar254 + fVar79;
            fVar157 = fVar256 + fVar117;
            fVar158 = fVar326 + fVar121;
            fVar206 = fVar171 * 0.0 * auVar322._0_4_;
            fVar230 = fVar188 * 0.0 * auVar322._4_4_;
            fVar253 = fVar191 * 0.0 * auVar322._8_4_;
            fVar262 = fVar204 * 0.0 * auVar322._12_4_;
            fVar171 = fVar329 - fVar308;
            fVar188 = fVar330 - fVar311;
            fVar191 = fVar333 - fVar318;
            fVar204 = fVar334 - fVar320;
            fVar172 = fVar189 + fVar206;
            fVar173 = fVar190 + fVar230;
            fVar194 = fVar192 + fVar253;
            fVar195 = fVar193 + fVar262;
            fVar299 = fVar337 - fVar154;
            fVar309 = fVar338 - fVar156;
            fVar313 = fVar273 - fVar159;
            fVar319 = fVar283 - fVar169;
            fVar255 = fVar255 - fVar269;
            fVar257 = fVar257 - fVar270;
            fVar272 = fVar272 - fVar312;
            fVar282 = fVar282 - fVar258;
            uVar75 = -(uint)(0.0 < (fVar299 * (fVar172 - fVar255) - fVar255 * (fVar122 - fVar299)) *
                                   0.0 + (fVar255 * (fVar239 - fVar171) -
                                         (fVar172 - fVar255) * fVar171) * 0.0 +
                                         ((fVar122 - fVar299) * fVar171 -
                                         (fVar239 - fVar171) * fVar299));
            uVar74 = -(uint)(0.0 < (fVar309 * (fVar173 - fVar257) - fVar257 * (fVar155 - fVar309)) *
                                   0.0 + (fVar257 * (fVar242 - fVar188) -
                                         (fVar173 - fVar257) * fVar188) * 0.0 +
                                         ((fVar155 - fVar309) * fVar188 -
                                         (fVar242 - fVar188) * fVar309));
            uVar76 = -(uint)(0.0 < (fVar313 * (fVar194 - fVar272) - fVar272 * (fVar157 - fVar313)) *
                                   0.0 + (fVar272 * (fVar286 - fVar191) -
                                         (fVar194 - fVar272) * fVar191) * 0.0 +
                                         ((fVar157 - fVar313) * fVar191 -
                                         (fVar286 - fVar191) * fVar313));
            uVar77 = -(uint)(0.0 < (fVar319 * (fVar195 - fVar282) - fVar282 * (fVar158 - fVar319)) *
                                   0.0 + (fVar282 * (fVar288 - fVar204) -
                                         (fVar195 - fVar282) * fVar204) * 0.0 +
                                         ((fVar158 - fVar319) * fVar204 -
                                         (fVar288 - fVar204) * fVar319));
            fVar310 = (float)((uint)(fVar310 - fVar118) & uVar75 |
                             ~uVar75 & (uint)(fVar329 + fVar308));
            fVar118 = (float)((uint)(fVar120 - fVar232) & uVar74 |
                             ~uVar74 & (uint)(fVar330 + fVar311));
            fVar120 = (float)((uint)(fVar237 - fVar243) & uVar76 |
                             ~uVar76 & (uint)(fVar333 + fVar318));
            fVar232 = (float)((uint)(fVar240 - fVar252) & uVar77 |
                             ~uVar77 & (uint)(fVar334 + fVar320));
            fVar337 = (float)((uint)(fVar251 - fVar170) & uVar75 |
                             ~uVar75 & (uint)(fVar337 + fVar154));
            fVar338 = (float)((uint)(fVar254 - fVar79) & uVar74 |
                             ~uVar74 & (uint)(fVar338 + fVar156));
            fVar273 = (float)((uint)(fVar256 - fVar117) & uVar76 |
                             ~uVar76 & (uint)(fVar273 + fVar159));
            fVar283 = (float)((uint)(fVar326 - fVar121) & uVar77 |
                             ~uVar77 & (uint)(fVar283 + fVar169));
            fVar154 = (float)((uint)(fVar189 - fVar206) & uVar75 | ~uVar75 & (uint)local_338);
            fVar156 = (float)((uint)(fVar190 - fVar230) & uVar74 | ~uVar74 & (uint)fStack_334);
            fVar159 = (float)((uint)(fVar192 - fVar253) & uVar76 | ~uVar76 & (uint)fStack_330);
            fVar169 = (float)((uint)(fVar193 - fVar262) & uVar77 | ~uVar77 & (uint)fStack_32c);
            fVar269 = (float)((uint)fVar171 & uVar75 | ~uVar75 & (uint)fVar239);
            fVar270 = (float)((uint)fVar188 & uVar74 | ~uVar74 & (uint)fVar242);
            fVar312 = (float)((uint)fVar191 & uVar76 | ~uVar76 & (uint)fVar286);
            fVar258 = (float)((uint)fVar204 & uVar77 | ~uVar77 & (uint)fVar288);
            fVar308 = (float)((uint)fVar299 & uVar75 | ~uVar75 & (uint)fVar122);
            fVar311 = (float)((uint)fVar309 & uVar74 | ~uVar74 & (uint)fVar155);
            fVar318 = (float)((uint)fVar313 & uVar76 | ~uVar76 & (uint)fVar157);
            fVar320 = (float)((uint)fVar319 & uVar77 | ~uVar77 & (uint)fVar158);
            fVar206 = (float)((uint)fVar255 & uVar75 | ~uVar75 & (uint)fVar172);
            fVar230 = (float)((uint)fVar257 & uVar74 | ~uVar74 & (uint)fVar173);
            fVar253 = (float)((uint)fVar272 & uVar76 | ~uVar76 & (uint)fVar194);
            fVar262 = (float)((uint)fVar282 & uVar77 | ~uVar77 & (uint)fVar195);
            fVar237 = (float)((uint)fVar239 & uVar75 | ~uVar75 & (uint)fVar171) - fVar310;
            fVar239 = (float)((uint)fVar242 & uVar74 | ~uVar74 & (uint)fVar188) - fVar118;
            fVar240 = (float)((uint)fVar286 & uVar76 | ~uVar76 & (uint)fVar191) - fVar120;
            fVar242 = (float)((uint)fVar288 & uVar77 | ~uVar77 & (uint)fVar204) - fVar232;
            fVar299 = (float)((uint)fVar122 & uVar75 | ~uVar75 & (uint)fVar299) - fVar337;
            fVar309 = (float)((uint)fVar155 & uVar74 | ~uVar74 & (uint)fVar309) - fVar338;
            fVar313 = (float)((uint)fVar157 & uVar76 | ~uVar76 & (uint)fVar313) - fVar273;
            fVar319 = (float)((uint)fVar158 & uVar77 | ~uVar77 & (uint)fVar319) - fVar283;
            fVar251 = (float)((uint)fVar172 & uVar75 | ~uVar75 & (uint)fVar255) - fVar154;
            fVar254 = (float)((uint)fVar173 & uVar74 | ~uVar74 & (uint)fVar257) - fVar156;
            fVar256 = (float)((uint)fVar194 & uVar76 | ~uVar76 & (uint)fVar272) - fVar159;
            fVar326 = (float)((uint)fVar195 & uVar77 | ~uVar77 & (uint)fVar282) - fVar169;
            fVar286 = fVar310 - fVar269;
            fVar288 = fVar118 - fVar270;
            fVar122 = fVar120 - fVar312;
            fVar155 = fVar232 - fVar258;
            fVar170 = fVar337 - fVar308;
            fVar79 = fVar338 - fVar311;
            fVar117 = fVar273 - fVar318;
            fVar121 = fVar283 - fVar320;
            fVar171 = fVar154 - fVar206;
            fVar188 = fVar156 - fVar230;
            fVar191 = fVar159 - fVar253;
            fVar204 = fVar169 - fVar262;
            fVar329 = (fVar337 * fVar251 - fVar154 * fVar299) * 0.0 +
                      (fVar154 * fVar237 - fVar310 * fVar251) * 0.0 +
                      (fVar310 * fVar299 - fVar337 * fVar237);
            fVar330 = (fVar338 * fVar254 - fVar156 * fVar309) * 0.0 +
                      (fVar156 * fVar239 - fVar118 * fVar254) * 0.0 +
                      (fVar118 * fVar309 - fVar338 * fVar239);
            auVar183._4_4_ = fVar330;
            auVar183._0_4_ = fVar329;
            fVar333 = (fVar273 * fVar256 - fVar159 * fVar313) * 0.0 +
                      (fVar159 * fVar240 - fVar120 * fVar256) * 0.0 +
                      (fVar120 * fVar313 - fVar273 * fVar240);
            fVar334 = (fVar283 * fVar326 - fVar169 * fVar319) * 0.0 +
                      (fVar169 * fVar242 - fVar232 * fVar326) * 0.0 +
                      (fVar232 * fVar319 - fVar283 * fVar242);
            auVar323._0_4_ =
                 (fVar308 * fVar171 - fVar206 * fVar170) * 0.0 +
                 (fVar206 * fVar286 - fVar269 * fVar171) * 0.0 +
                 (fVar269 * fVar170 - fVar308 * fVar286);
            auVar323._4_4_ =
                 (fVar311 * fVar188 - fVar230 * fVar79) * 0.0 +
                 (fVar230 * fVar288 - fVar270 * fVar188) * 0.0 +
                 (fVar270 * fVar79 - fVar311 * fVar288);
            auVar323._8_4_ =
                 (fVar318 * fVar191 - fVar253 * fVar117) * 0.0 +
                 (fVar253 * fVar122 - fVar312 * fVar191) * 0.0 +
                 (fVar312 * fVar117 - fVar318 * fVar122);
            auVar323._12_4_ =
                 (fVar320 * fVar204 - fVar262 * fVar121) * 0.0 +
                 (fVar262 * fVar155 - fVar258 * fVar204) * 0.0 +
                 (fVar258 * fVar121 - fVar320 * fVar155);
            auVar183._8_4_ = fVar333;
            auVar183._12_4_ = fVar334;
            auVar80 = maxps(auVar183,auVar323);
            bVar52 = auVar80._0_4_ <= 0.0 && bVar52;
            auVar184._0_4_ = -(uint)bVar52;
            bVar53 = auVar80._4_4_ <= 0.0 && bVar53;
            auVar184._4_4_ = -(uint)bVar53;
            bVar51 = auVar80._8_4_ <= 0.0 && bVar51;
            auVar184._8_4_ = -(uint)bVar51;
            bVar50 = auVar80._12_4_ <= 0.0 && bVar50;
            auVar184._12_4_ = -(uint)bVar50;
            iVar55 = movmskps((int)(bezier_basis1 + lVar23),auVar184);
            if (iVar55 == 0) {
              auVar165._8_8_ = uStack_390;
              auVar165._0_8_ = local_398;
              iVar55 = 0;
            }
            else {
              fVar230 = fVar170 * fVar251 - fVar171 * fVar299;
              fVar253 = fVar79 * fVar254 - fVar188 * fVar309;
              fVar262 = fVar117 * fVar256 - fVar191 * fVar313;
              fVar269 = fVar121 * fVar326 - fVar204 * fVar319;
              fVar206 = fVar171 * fVar237 - fVar251 * fVar286;
              fVar188 = fVar188 * fVar239 - fVar254 * fVar288;
              fVar191 = fVar191 * fVar240 - fVar256 * fVar122;
              fVar204 = fVar204 * fVar242 - fVar326 * fVar155;
              fVar170 = fVar286 * fVar299 - fVar170 * fVar237;
              fVar270 = fVar288 * fVar309 - fVar79 * fVar239;
              fVar312 = fVar122 * fVar313 - fVar117 * fVar240;
              fVar258 = fVar155 * fVar319 - fVar121 * fVar242;
              auVar164._0_4_ = fVar206 * 0.0 + fVar170;
              auVar164._4_4_ = fVar188 * 0.0 + fVar270;
              auVar164._8_4_ = fVar191 * 0.0 + fVar312;
              auVar164._12_4_ = fVar204 * 0.0 + fVar258;
              auVar235._0_4_ = fVar230 * 0.0 + auVar164._0_4_;
              auVar235._4_4_ = fVar253 * 0.0 + auVar164._4_4_;
              auVar235._8_4_ = fVar262 * 0.0 + auVar164._8_4_;
              auVar235._12_4_ = fVar269 * 0.0 + auVar164._12_4_;
              auVar80 = rcpps(auVar164,auVar235);
              fVar79 = auVar80._0_4_;
              fVar117 = auVar80._4_4_;
              fVar121 = auVar80._8_4_;
              fVar171 = auVar80._12_4_;
              fVar79 = (1.0 - auVar235._0_4_ * fVar79) * fVar79 + fVar79;
              fVar117 = (1.0 - auVar235._4_4_ * fVar117) * fVar117 + fVar117;
              fVar121 = (1.0 - auVar235._8_4_ * fVar121) * fVar121 + fVar121;
              fVar171 = (1.0 - auVar235._12_4_ * fVar171) * fVar171 + fVar171;
              fVar154 = (fVar154 * fVar170 + fVar337 * fVar206 + fVar310 * fVar230) * fVar79;
              fVar156 = (fVar156 * fVar270 + fVar338 * fVar188 + fVar118 * fVar253) * fVar117;
              fVar159 = (fVar159 * fVar312 + fVar273 * fVar191 + fVar120 * fVar262) * fVar121;
              fVar169 = (fVar169 * fVar258 + fVar283 * fVar204 + fVar232 * fVar269) * fVar171;
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              bVar52 = (fVar154 <= fVar170 && (float)local_388._0_4_ <= fVar154) && bVar52;
              auVar202._0_4_ = -(uint)bVar52;
              bVar53 = (fVar156 <= fVar170 && (float)local_388._4_4_ <= fVar156) && bVar53;
              auVar202._4_4_ = -(uint)bVar53;
              bVar51 = (fVar159 <= fVar170 && fStack_380 <= fVar159) && bVar51;
              auVar202._8_4_ = -(uint)bVar51;
              bVar50 = (fVar169 <= fVar170 && fStack_37c <= fVar169) && bVar50;
              auVar202._12_4_ = -(uint)bVar50;
              iVar55 = movmskps(iVar55,auVar202);
              if (iVar55 == 0) {
                auVar165._8_8_ = uStack_390;
                auVar165._0_8_ = local_398;
                iVar55 = 0;
              }
              else {
                auVar203._0_8_ =
                     CONCAT44(-(uint)(auVar235._4_4_ != 0.0 && bVar53),
                              -(uint)(auVar235._0_4_ != 0.0 && bVar52));
                auVar203._8_4_ = -(uint)(auVar235._8_4_ != 0.0 && bVar51);
                auVar203._12_4_ = -(uint)(auVar235._12_4_ != 0.0 && bVar50);
                iVar55 = movmskps(iVar55,auVar203);
                auVar165._8_8_ = uStack_390;
                auVar165._0_8_ = local_398;
                if (iVar55 != 0) {
                  fVar329 = fVar329 * fVar79;
                  fVar330 = fVar330 * fVar117;
                  fVar333 = fVar333 * fVar121;
                  fVar334 = fVar334 * fVar171;
                  local_3a8 = (float)((uint)(1.0 - fVar329) & uVar75 | ~uVar75 & (uint)fVar329);
                  fStack_3a4 = (float)((uint)(1.0 - fVar330) & uVar74 | ~uVar74 & (uint)fVar330);
                  fStack_3a0 = (float)((uint)(1.0 - fVar333) & uVar76 | ~uVar76 & (uint)fVar333);
                  fStack_39c = (float)((uint)(1.0 - fVar334) & uVar77 | ~uVar77 & (uint)fVar334);
                  local_428 = (float)(~uVar75 & (uint)(auVar323._0_4_ * fVar79) |
                                     (uint)(1.0 - auVar323._0_4_ * fVar79) & uVar75);
                  fStack_424 = (float)(~uVar74 & (uint)(auVar323._4_4_ * fVar117) |
                                      (uint)(1.0 - auVar323._4_4_ * fVar117) & uVar74);
                  fStack_420 = (float)(~uVar76 & (uint)(auVar323._8_4_ * fVar121) |
                                      (uint)(1.0 - auVar323._8_4_ * fVar121) & uVar76);
                  fStack_41c = (float)(~uVar77 & (uint)(auVar323._12_4_ * fVar171) |
                                      (uint)(1.0 - auVar323._12_4_ * fVar171) & uVar77);
                  auVar165._8_4_ = auVar203._8_4_;
                  auVar165._0_8_ = auVar203._0_8_;
                  auVar165._12_4_ = auVar203._12_4_;
                  local_508 = fVar154;
                  fStack_504 = fVar156;
                  fStack_500 = fVar159;
                  fStack_4fc = fVar169;
                }
              }
            }
            iVar55 = movmskps(iVar55,auVar165);
            fVar299 = local_3a8;
            fVar308 = fStack_3a4;
            fVar309 = fStack_3a0;
            fVar311 = fStack_39c;
            _local_268 = auVar249;
            if (iVar55 != 0) {
              fVar79 = (auVar322._0_4_ - auVar142._0_4_) * local_3a8 + auVar142._0_4_;
              fVar117 = (auVar322._4_4_ - auVar142._4_4_) * fStack_3a4 + auVar142._4_4_;
              fVar121 = (auVar322._8_4_ - auVar142._8_4_) * fStack_3a0 + auVar142._8_4_;
              fVar154 = (auVar322._12_4_ - auVar142._12_4_) * fStack_39c + auVar142._12_4_;
              fVar170 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
              auVar106._0_4_ = -(uint)(fVar170 * (fVar79 + fVar79) < local_508) & auVar165._0_4_;
              auVar106._4_4_ = -(uint)(fVar170 * (fVar117 + fVar117) < fStack_504) & auVar165._4_4_;
              auVar106._8_4_ = -(uint)(fVar170 * (fVar121 + fVar121) < fStack_500) & auVar165._8_4_;
              auVar106._12_4_ =
                   -(uint)(fVar170 * (fVar154 + fVar154) < fStack_4fc) & auVar165._12_4_;
              iVar55 = movmskps((int)local_3b0,auVar106);
              if (iVar55 != 0) {
                local_428 = local_428 + local_428 + -1.0;
                fStack_424 = fStack_424 + fStack_424 + -1.0;
                fStack_420 = fStack_420 + fStack_420 + -1.0;
                fStack_41c = fStack_41c + fStack_41c + -1.0;
                local_1e8 = CONCAT44(fVar205,fVar196);
                uStack_1e0 = CONCAT44(fVar231,fVar229);
                local_1d8 = CONCAT44(fStack_294,local_298);
                uStack_1d0 = CONCAT44(fStack_28c,fStack_290);
                local_1c8 = CONCAT44(fStack_2a4,local_2a8);
                uStack_1c0 = CONCAT44(fStack_29c,fStack_2a0);
                local_1b8 = CONCAT44(fStack_284,local_288);
                uStack_1b0 = CONCAT44(fStack_27c,fStack_280);
                pGVar66 = (context->scene->geometries).items[(long)pRVar63].ptr;
                pRVar64 = pRVar63;
                local_228 = local_3a8;
                fStack_224 = fStack_3a4;
                fStack_220 = fStack_3a0;
                fStack_21c = fStack_39c;
                local_218 = local_428;
                fStack_214 = fStack_424;
                fStack_210 = fStack_420;
                fStack_20c = fStack_41c;
                local_208 = local_508;
                fStack_204 = fStack_504;
                fStack_200 = fStack_500;
                fStack_1fc = fStack_4fc;
                local_1f8 = uVar72;
                local_1f4 = iVar19;
                local_1a8 = auVar106;
                if ((pGVar66->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar170 = (float)(int)uVar72;
                  local_198[0] = (fVar170 + local_3a8 + 0.0) * local_68;
                  local_198[1] = (fVar170 + fStack_3a4 + 1.0) * fStack_64;
                  local_198[2] = (fVar170 + fStack_3a0 + 2.0) * fStack_60;
                  local_198[3] = (fVar170 + fStack_39c + 3.0) * fStack_5c;
                  local_188 = CONCAT44(fStack_424,local_428);
                  uStack_180 = CONCAT44(fStack_41c,fStack_420);
                  local_178[0] = local_508;
                  local_178[1] = fStack_504;
                  local_178[2] = fStack_500;
                  local_178[3] = fStack_4fc;
                  auVar143._0_4_ = auVar106._0_4_ & (uint)local_508;
                  auVar143._4_4_ = auVar106._4_4_ & (uint)fStack_504;
                  auVar143._8_4_ = auVar106._8_4_ & (uint)fStack_500;
                  auVar143._12_4_ = auVar106._12_4_ & (uint)fStack_4fc;
                  auVar166._0_8_ = CONCAT44(~auVar106._4_4_,~auVar106._0_4_) & 0x7f8000007f800000;
                  auVar166._8_4_ = ~auVar106._8_4_ & 0x7f800000;
                  auVar166._12_4_ = ~auVar106._12_4_ & 0x7f800000;
                  auVar166 = auVar166 | auVar143;
                  auVar185._4_4_ = auVar166._0_4_;
                  auVar185._0_4_ = auVar166._4_4_;
                  auVar185._8_4_ = auVar166._12_4_;
                  auVar185._12_4_ = auVar166._8_4_;
                  auVar80 = minps(auVar185,auVar166);
                  auVar144._0_8_ = auVar80._8_8_;
                  auVar144._8_4_ = auVar80._0_4_;
                  auVar144._12_4_ = auVar80._4_4_;
                  auVar80 = minps(auVar144,auVar80);
                  auVar145._0_8_ =
                       CONCAT44(-(uint)(auVar80._4_4_ == auVar166._4_4_) & auVar106._4_4_,
                                -(uint)(auVar80._0_4_ == auVar166._0_4_) & auVar106._0_4_);
                  auVar145._8_4_ = -(uint)(auVar80._8_4_ == auVar166._8_4_) & auVar106._8_4_;
                  auVar145._12_4_ = -(uint)(auVar80._12_4_ == auVar166._12_4_) & auVar106._12_4_;
                  iVar55 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar145);
                  auVar107 = auVar106;
                  if (iVar55 != 0) {
                    auVar107._8_4_ = auVar145._8_4_;
                    auVar107._0_8_ = auVar145._0_8_;
                    auVar107._12_4_ = auVar145._12_4_;
                  }
                  uVar75 = movmskps(iVar55,auVar107);
                  lVar68 = 0;
                  if (uVar75 != 0) {
                    for (; (uVar75 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
                    }
                  }
                  local_3d8 = auVar106;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar66->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar170 = local_198[lVar68];
                    uVar62 = *(undefined4 *)((long)&local_188 + lVar68 * 4);
                    fVar79 = 1.0 - fVar170;
                    fVar121 = fVar170 * fVar79 + fVar170 * fVar79;
                    fVar117 = fVar79 * fVar79 * -3.0;
                    fVar154 = (fVar79 * fVar79 - fVar121) * 3.0;
                    fVar79 = (fVar121 - fVar170 * fVar170) * 3.0;
                    fVar121 = fVar170 * fVar170 * 3.0;
                    *(float *)(ray + k * 4 + 0x80) = local_178[lVar68];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar117 * fVar196 +
                         fVar154 * local_298 + fVar79 * local_2a8 + fVar121 * local_288;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar117 * fVar205 +
                         fVar154 * fStack_294 + fVar79 * fStack_2a4 + fVar121 * fStack_284;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar117 * fVar229 +
                         fVar154 * fStack_290 + fVar79 * fStack_2a0 + fVar121 * fStack_280;
                    *(float *)(ray + k * 4 + 0xf0) = fVar170;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar62;
                    *(uint *)(ray + k * 4 + 0x110) = uVar73;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pRVar64 = (RTCIntersectArguments *)context;
                    prim = local_2c0;
                  }
                  else {
                    uVar119 = *local_2c8;
                    uVar26 = local_2c8[1];
                    do {
                      local_e8 = local_198[lVar68];
                      uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_d8 = *(undefined4 *)((long)&local_188 + lVar68 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_178[lVar68];
                      fVar170 = 1.0 - local_e8;
                      fVar117 = local_e8 * fVar170 + local_e8 * fVar170;
                      fVar121 = (fVar117 - local_e8 * local_e8) * 3.0;
                      fVar79 = local_e8 * local_e8 * 3.0;
                      fVar117 = (fVar170 * fVar170 - fVar117) * 3.0;
                      local_378.context = context->user;
                      fVar170 = fVar170 * fVar170 * -3.0;
                      local_118._0_4_ =
                           fVar170 * fVar196 +
                           fVar117 * fVar281 + fVar121 * fVar260 + fVar79 * fVar296;
                      local_108 = fVar170 * fVar205 +
                                  fVar117 * fVar284 + fVar121 * fVar261 + fVar79 * fVar297;
                      local_f8 = fVar170 * fVar229 +
                                 fVar117 * fVar289 + fVar121 * fVar271 + fVar79 * fVar298;
                      local_118._4_4_ = local_118._0_4_;
                      local_118._8_4_ = local_118._0_4_;
                      fStack_10c = (float)local_118._0_4_;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      uStack_d4 = local_d8;
                      uStack_d0 = local_d8;
                      uStack_cc = local_d8;
                      local_c8 = CONCAT44(uStack_84,local_88);
                      uStack_c0 = CONCAT44(uStack_7c,uStack_80);
                      local_b8 = CONCAT44(uStack_74,local_78);
                      uStack_b0 = CONCAT44(uStack_6c,uStack_70);
                      local_a8 = (local_378.context)->instID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_98 = (local_378.context)->instPrimID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_378.valid = (int *)&local_3c8;
                      pRVar64 = (RTCIntersectArguments *)pGVar66->userPtr;
                      local_378.hit = (RTCHitN *)local_118;
                      local_378.N = 4;
                      p_Var58 = pGVar66->intersectionFilterN;
                      local_3c8 = uVar119;
                      uStack_3c0 = uVar26;
                      local_378.geometryUserPtr = pRVar64;
                      local_378.ray = (RTCRayN *)ray;
                      if (p_Var58 != (RTCFilterFunctionN)0x0) {
                        p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&local_378);
                        fVar299 = local_3a8;
                        fVar308 = fStack_3a4;
                        fVar309 = fStack_3a0;
                        fVar311 = fStack_39c;
                      }
                      auVar108._0_4_ = -(uint)((int)local_3c8 == 0);
                      auVar108._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                      auVar108._8_4_ = -(uint)((int)uStack_3c0 == 0);
                      auVar108._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                      uVar75 = movmskps((int)p_Var58,auVar108);
                      pRVar59 = (RayHitK<4> *)(ulong)(uVar75 ^ 0xf);
                      if ((uVar75 ^ 0xf) == 0) {
                        auVar108 = auVar108 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar64 = context->args;
                        pRVar60 = (RTCIntersectArguments *)pRVar64->filter;
                        if ((pRVar60 != (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar64->flags & 2) != 0 ||
                            (((pGVar66->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar60 = (RTCIntersectArguments *)(*(code *)pRVar60)(&local_378);
                          fVar299 = local_3a8;
                          fVar308 = fStack_3a4;
                          fVar309 = fStack_3a0;
                          fVar311 = fStack_39c;
                        }
                        auVar146._0_4_ = -(uint)((int)local_3c8 == 0);
                        auVar146._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                        auVar146._8_4_ = -(uint)((int)uStack_3c0 == 0);
                        auVar146._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                        auVar108 = auVar146 ^ _DAT_01febe20;
                        uVar75 = movmskps((int)pRVar60,auVar146);
                        pRVar59 = (RayHitK<4> *)(ulong)(uVar75 ^ 0xf);
                        if ((uVar75 ^ 0xf) != 0) {
                          RVar25 = *(RTCFeatureFlags *)((long)local_378.hit + 4);
                          uVar75 = *(uint *)((long)local_378.hit + 8);
                          uVar72 = *(uint *)((long)((long)local_378.hit + 8) + 4);
                          *(uint *)(local_378.ray + 0xc0) =
                               ~auVar146._0_4_ & *(uint *)&(local_378.hit)->field_0x0 |
                               *(uint *)(local_378.ray + 0xc0) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xc4) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xc4) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 200) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 200) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0xcc) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0xcc) & auVar146._12_4_;
                          RVar25 = *(RTCFeatureFlags *)((long)((long)local_378.hit + 0x10) + 4);
                          uVar75 = *(uint *)((long)local_378.hit + 0x18);
                          uVar72 = *(uint *)((long)((long)local_378.hit + 0x18) + 4);
                          *(uint *)(local_378.ray + 0xd0) =
                               ~auVar146._0_4_ & *(uint *)((long)local_378.hit + 0x10) |
                               *(uint *)(local_378.ray + 0xd0) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xd4) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xd4) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 0xd8) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 0xd8) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0xdc) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0xdc) & auVar146._12_4_;
                          RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                   feature_mask;
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))
                                             ->context;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0xe0) =
                               ~auVar146._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->flags |
                               *(uint *)(local_378.ray + 0xe0) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xe4) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xe4) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 0xe8) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 0xe8) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0xec) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0xec) & auVar146._12_4_;
                          RVar25 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))
                                            ->filter + 4);
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))
                                             ->intersect;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x20))->intersect + 4);
                          *(uint *)(local_378.ray + 0xf0) =
                               ~auVar146._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                         filter | *(uint *)(local_378.ray + 0xf0) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xf4) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xf4) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 0xf8) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 0xf8) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0xfc) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0xfc) & auVar146._12_4_;
                          RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                   feature_mask;
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))
                                             ->context;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0x100) =
                               ~auVar146._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->flags |
                               *(uint *)(local_378.ray + 0x100) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0x104) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0x104) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 0x108) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 0x108) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0x10c) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0x10c) & auVar146._12_4_;
                          RVar25 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))
                                            ->filter + 4);
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))
                                             ->intersect;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x40))->intersect + 4);
                          *(uint *)(local_378.ray + 0x110) =
                               *(uint *)(local_378.ray + 0x110) & auVar146._0_4_ |
                               ~auVar146._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                         filter;
                          *(RTCFeatureFlags *)(local_378.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_378.ray + 0x114) & auVar146._4_4_ |
                               ~auVar146._4_4_ & RVar25;
                          *(uint *)(local_378.ray + 0x118) =
                               *(uint *)(local_378.ray + 0x118) & auVar146._8_4_ |
                               ~auVar146._8_4_ & uVar75;
                          *(uint *)(local_378.ray + 0x11c) =
                               *(uint *)(local_378.ray + 0x11c) & auVar146._12_4_ |
                               ~auVar146._12_4_ & uVar72;
                          RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                   feature_mask;
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))
                                             ->context;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0x120) =
                               *(uint *)(local_378.ray + 0x120) & auVar146._0_4_ |
                               ~auVar146._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_378.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_378.ray + 0x124) & auVar146._4_4_ |
                               ~auVar146._4_4_ & RVar25;
                          *(uint *)(local_378.ray + 0x128) =
                               *(uint *)(local_378.ray + 0x128) & auVar146._8_4_ |
                               ~auVar146._8_4_ & uVar75;
                          *(uint *)(local_378.ray + 300) =
                               *(uint *)(local_378.ray + 300) & auVar146._12_4_ |
                               ~auVar146._12_4_ & uVar72;
                          RVar25 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))
                                            ->filter + 4);
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))
                                             ->intersect;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x60))->intersect + 4);
                          *(uint *)(local_378.ray + 0x130) =
                               ~auVar146._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                         filter | *(uint *)(local_378.ray + 0x130) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0x134) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0x134) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 0x138) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 0x138) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0x13c) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0x13c) & auVar146._12_4_;
                          RVar25 = ((RTCIntersectArguments *)((long)local_378.hit + 0x80))->
                                   feature_mask;
                          uVar75 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x80))
                                             ->context;
                          uVar72 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x80))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0x140) =
                               ~auVar146._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x80))->flags |
                               *(uint *)(local_378.ray + 0x140) & auVar146._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0x144) =
                               ~auVar146._4_4_ & RVar25 |
                               *(RTCFeatureFlags *)(local_378.ray + 0x144) & auVar146._4_4_;
                          *(uint *)(local_378.ray + 0x148) =
                               ~auVar146._8_4_ & uVar75 |
                               *(uint *)(local_378.ray + 0x148) & auVar146._8_4_;
                          *(uint *)(local_378.ray + 0x14c) =
                               ~auVar146._12_4_ & uVar72 |
                               *(uint *)(local_378.ray + 0x14c) & auVar146._12_4_;
                          pRVar59 = (RayHitK<4> *)local_378.ray;
                          pRVar64 = (RTCIntersectArguments *)local_378.hit;
                        }
                      }
                      auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                      auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                      auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                      auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                      iVar55 = movmskps((int)pRVar59,auVar109);
                      if (iVar55 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar62;
                      }
                      *(undefined4 *)(local_3d8 + lVar68 * 4) = 0;
                      fVar170 = *(float *)(ray + k * 4 + 0x80);
                      local_3d8._0_4_ = -(uint)(local_508 <= fVar170) & local_3d8._0_4_;
                      local_3d8._4_4_ = -(uint)(fStack_504 <= fVar170) & local_3d8._4_4_;
                      local_3d8._8_4_ = -(uint)(fStack_500 <= fVar170) & local_3d8._8_4_;
                      local_3d8._12_4_ = -(uint)(fStack_4fc <= fVar170) & local_3d8._12_4_;
                      iVar55 = movmskps(iVar55,local_3d8);
                      if (iVar55 != 0) {
                        auVar147._0_4_ = local_3d8._0_4_ & (uint)local_508;
                        auVar147._4_4_ = local_3d8._4_4_ & (uint)fStack_504;
                        auVar147._8_4_ = local_3d8._8_4_ & (uint)fStack_500;
                        auVar147._12_4_ = local_3d8._12_4_ & (uint)fStack_4fc;
                        auVar167._0_8_ =
                             CONCAT44(~local_3d8._4_4_,~local_3d8._0_4_) & 0x7f8000007f800000;
                        auVar167._8_4_ = ~local_3d8._8_4_ & 0x7f800000;
                        auVar167._12_4_ = ~local_3d8._12_4_ & 0x7f800000;
                        auVar167 = auVar167 | auVar147;
                        auVar186._4_4_ = auVar167._0_4_;
                        auVar186._0_4_ = auVar167._4_4_;
                        auVar186._8_4_ = auVar167._12_4_;
                        auVar186._12_4_ = auVar167._8_4_;
                        auVar80 = minps(auVar186,auVar167);
                        auVar148._0_8_ = auVar80._8_8_;
                        auVar148._8_4_ = auVar80._0_4_;
                        auVar148._12_4_ = auVar80._4_4_;
                        auVar80 = minps(auVar148,auVar80);
                        auVar149._0_8_ =
                             CONCAT44(-(uint)(auVar80._4_4_ == auVar167._4_4_) & local_3d8._4_4_,
                                      -(uint)(auVar80._0_4_ == auVar167._0_4_) & local_3d8._0_4_);
                        auVar149._8_4_ = -(uint)(auVar80._8_4_ == auVar167._8_4_) & local_3d8._8_4_;
                        auVar149._12_4_ =
                             -(uint)(auVar80._12_4_ == auVar167._12_4_) & local_3d8._12_4_;
                        iVar61 = movmskps((int)pRVar64,auVar149);
                        auVar110 = local_3d8;
                        if (iVar61 != 0) {
                          auVar110._8_4_ = auVar149._8_4_;
                          auVar110._0_8_ = auVar149._0_8_;
                          auVar110._12_4_ = auVar149._12_4_;
                        }
                        uVar62 = movmskps(iVar61,auVar110);
                        pRVar64 = (RTCIntersectArguments *)
                                  CONCAT44((int)((ulong)pRVar64 >> 0x20),uVar62);
                        lVar68 = 0;
                        if (pRVar64 != (RTCIntersectArguments *)0x0) {
                          for (; ((ulong)pRVar64 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
                          }
                        }
                      }
                      prim = local_2c0;
                    } while ((char)iVar55 != '\0');
                  }
                }
              }
            }
          }
          iVar61 = (int)pRVar64;
          lVar67 = lVar67 + 4;
          local_3a8 = fVar299;
          fStack_3a4 = fVar308;
          fStack_3a0 = fVar309;
          fStack_39c = fVar311;
        } while ((int)lVar67 < iVar19);
      }
      fVar170 = *(float *)(ray + k * 4 + 0x80);
      auVar141._4_4_ = -(uint)(fStack_44 <= fVar170);
      auVar141._0_4_ = -(uint)(local_48 <= fVar170);
      auVar141._8_4_ = -(uint)(fStack_40 <= fVar170);
      auVar141._12_4_ = -(uint)(fStack_3c <= fVar170);
      uVar71 = movmskps(iVar61,auVar141);
      uVar70 = uVar70 & uVar70 + 0xf & uVar71;
    } while (uVar70 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }